

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  uint uVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  undefined1 auVar93 [28];
  undefined1 auVar94 [32];
  undefined1 auVar95 [24];
  int iVar96;
  uint uVar97;
  ulong uVar98;
  RTCIntersectArguments *pRVar99;
  ulong uVar100;
  long lVar101;
  ulong uVar102;
  ulong uVar103;
  undefined4 uVar104;
  undefined8 unaff_R13;
  long lVar105;
  ulong uVar106;
  undefined8 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar109 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined8 uVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  undefined1 auVar134 [16];
  float fVar133;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar135 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined8 uVar160;
  float fVar171;
  undefined1 auVar161 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar170;
  float fVar172;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [16];
  undefined1 auVar189 [32];
  undefined1 auVar188 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar202 [16];
  undefined4 uVar201;
  undefined1 auVar203 [64];
  float fVar204;
  float fVar205;
  float fVar210;
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar213;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar222;
  float fVar225;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  RTCFilterFunctionNArguments args;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  RTCFilterFunctionNArguments local_6e0;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  LinearSpace3fa *local_5d0;
  ulong local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar102 = (ulong)(byte)PVar17;
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar133 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar152 = vsubps_avx(auVar152,*(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  auVar108._0_4_ = fVar133 * auVar152._0_4_;
  auVar108._4_4_ = fVar133 * auVar152._4_4_;
  auVar108._8_4_ = fVar133 * auVar152._8_4_;
  auVar108._12_4_ = fVar133 * auVar152._12_4_;
  auVar161._0_4_ = fVar133 * auVar20._0_4_;
  auVar161._4_4_ = fVar133 * auVar20._4_4_;
  auVar161._8_4_ = fVar133 * auVar20._8_4_;
  auVar161._12_4_ = fVar133 * auVar20._12_4_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar111 = vpmovsxbd_avx2(auVar152);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar142 = vpmovsxbd_avx2(auVar20);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar169 = vpmovsxbd_avx2(auVar11);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar119 = vpmovsxbd_avx2(auVar12);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar102 * 0xc + 6);
  auVar129 = vpmovsxbd_avx2(auVar13);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar102 * 0xd + 6);
  auVar23 = vpmovsxbd_avx2(auVar14);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar102 * 0x12 + 6);
  auVar165 = vpmovsxbd_avx2(auVar149);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar102 * 0x13 + 6);
  auVar24 = vpmovsxbd_avx2(auVar15);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar102 * 0x14 + 6);
  auVar121 = vpmovsxbd_avx2(auVar16);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar190._4_4_ = auVar161._0_4_;
  auVar190._0_4_ = auVar161._0_4_;
  auVar190._8_4_ = auVar161._0_4_;
  auVar190._12_4_ = auVar161._0_4_;
  auVar190._16_4_ = auVar161._0_4_;
  auVar190._20_4_ = auVar161._0_4_;
  auVar190._24_4_ = auVar161._0_4_;
  auVar190._28_4_ = auVar161._0_4_;
  auVar152 = vmovshdup_avx(auVar161);
  uVar160 = auVar152._0_8_;
  auVar223._8_8_ = uVar160;
  auVar223._0_8_ = uVar160;
  auVar223._16_8_ = uVar160;
  auVar223._24_8_ = uVar160;
  auVar152 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar133 = auVar152._0_4_;
  auVar203._0_4_ = fVar133 * auVar169._0_4_;
  fVar132 = auVar152._4_4_;
  auVar203._4_4_ = fVar132 * auVar169._4_4_;
  auVar203._8_4_ = fVar133 * auVar169._8_4_;
  auVar203._12_4_ = fVar132 * auVar169._12_4_;
  auVar203._16_4_ = fVar133 * auVar169._16_4_;
  auVar203._20_4_ = fVar132 * auVar169._20_4_;
  auVar203._28_36_ = in_ZMM10._28_36_;
  auVar203._24_4_ = fVar133 * auVar169._24_4_;
  auVar159._0_4_ = auVar23._0_4_ * fVar133;
  auVar159._4_4_ = auVar23._4_4_ * fVar132;
  auVar159._8_4_ = auVar23._8_4_ * fVar133;
  auVar159._12_4_ = auVar23._12_4_ * fVar132;
  auVar159._16_4_ = auVar23._16_4_ * fVar133;
  auVar159._20_4_ = auVar23._20_4_ * fVar132;
  auVar159._28_36_ = in_ZMM9._28_36_;
  auVar159._24_4_ = auVar23._24_4_ * fVar133;
  auVar189._0_4_ = auVar121._0_4_ * fVar133;
  auVar189._4_4_ = auVar121._4_4_ * fVar132;
  auVar189._8_4_ = auVar121._8_4_ * fVar133;
  auVar189._12_4_ = auVar121._12_4_ * fVar132;
  auVar189._16_4_ = auVar121._16_4_ * fVar133;
  auVar189._20_4_ = auVar121._20_4_ * fVar132;
  auVar189._24_4_ = auVar121._24_4_ * fVar133;
  auVar189._28_4_ = 0;
  auVar152 = vfmadd231ps_fma(auVar203._0_32_,auVar223,auVar142);
  auVar20 = vfmadd231ps_fma(auVar159._0_32_,auVar223,auVar129);
  auVar11 = vfmadd231ps_fma(auVar189,auVar24,auVar223);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar190,auVar111);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar190,auVar119);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar165,auVar190);
  auVar211._4_4_ = auVar108._0_4_;
  auVar211._0_4_ = auVar108._0_4_;
  auVar211._8_4_ = auVar108._0_4_;
  auVar211._12_4_ = auVar108._0_4_;
  auVar211._16_4_ = auVar108._0_4_;
  auVar211._20_4_ = auVar108._0_4_;
  auVar211._24_4_ = auVar108._0_4_;
  auVar211._28_4_ = auVar108._0_4_;
  auVar152 = vmovshdup_avx(auVar108);
  uVar160 = auVar152._0_8_;
  auVar224._8_8_ = uVar160;
  auVar224._0_8_ = uVar160;
  auVar224._16_8_ = uVar160;
  auVar224._24_8_ = uVar160;
  auVar152 = vshufps_avx(auVar108,auVar108,0xaa);
  fVar133 = auVar152._0_4_;
  auVar162._0_4_ = fVar133 * auVar169._0_4_;
  fVar132 = auVar152._4_4_;
  auVar162._4_4_ = fVar132 * auVar169._4_4_;
  auVar162._8_4_ = fVar133 * auVar169._8_4_;
  auVar162._12_4_ = fVar132 * auVar169._12_4_;
  auVar162._16_4_ = fVar133 * auVar169._16_4_;
  auVar162._20_4_ = fVar132 * auVar169._20_4_;
  auVar162._24_4_ = fVar133 * auVar169._24_4_;
  auVar162._28_4_ = 0;
  auVar21._4_4_ = auVar23._4_4_ * fVar132;
  auVar21._0_4_ = auVar23._0_4_ * fVar133;
  auVar21._8_4_ = auVar23._8_4_ * fVar133;
  auVar21._12_4_ = auVar23._12_4_ * fVar132;
  auVar21._16_4_ = auVar23._16_4_ * fVar133;
  auVar21._20_4_ = auVar23._20_4_ * fVar132;
  auVar21._24_4_ = auVar23._24_4_ * fVar133;
  auVar21._28_4_ = auVar169._28_4_;
  auVar169._4_4_ = auVar121._4_4_ * fVar132;
  auVar169._0_4_ = auVar121._0_4_ * fVar133;
  auVar169._8_4_ = auVar121._8_4_ * fVar133;
  auVar169._12_4_ = auVar121._12_4_ * fVar132;
  auVar169._16_4_ = auVar121._16_4_ * fVar133;
  auVar169._20_4_ = auVar121._20_4_ * fVar132;
  auVar169._24_4_ = auVar121._24_4_ * fVar133;
  auVar169._28_4_ = fVar132;
  auVar152 = vfmadd231ps_fma(auVar162,auVar224,auVar142);
  auVar13 = vfmadd231ps_fma(auVar21,auVar224,auVar129);
  auVar14 = vfmadd231ps_fma(auVar169,auVar224,auVar24);
  auVar149 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar211,auVar111);
  local_420._8_4_ = 0x7fffffff;
  local_420._0_8_ = 0x7fffffff7fffffff;
  local_420._12_4_ = 0x7fffffff;
  local_420._16_4_ = 0x7fffffff;
  local_420._20_4_ = 0x7fffffff;
  local_420._24_4_ = 0x7fffffff;
  local_420._28_4_ = 0x7fffffff;
  auVar203 = ZEXT3264(local_420);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar211,auVar119);
  auVar111 = vandps_avx(ZEXT1632(auVar12),local_420);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar192._16_4_ = 0x219392ef;
  auVar192._20_4_ = 0x219392ef;
  auVar192._24_4_ = 0x219392ef;
  auVar192._28_4_ = 0x219392ef;
  auVar111 = vcmpps_avx(auVar111,auVar192,1);
  auVar142 = vblendvps_avx(ZEXT1632(auVar12),auVar192,auVar111);
  auVar111 = vandps_avx(ZEXT1632(auVar20),local_420);
  auVar111 = vcmpps_avx(auVar111,auVar192,1);
  auVar169 = vblendvps_avx(ZEXT1632(auVar20),auVar192,auVar111);
  auVar111 = vandps_avx(local_420,ZEXT1632(auVar11));
  auVar111 = vcmpps_avx(auVar111,auVar192,1);
  auVar119 = vrcpps_avx(auVar142);
  auVar111 = vblendvps_avx(ZEXT1632(auVar11),auVar192,auVar111);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar183._16_4_ = 0x3f800000;
  auVar183._20_4_ = 0x3f800000;
  auVar183._24_4_ = 0x3f800000;
  auVar183._28_4_ = 0x3f800000;
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar211,auVar165);
  auVar129 = vrcpps_avx(auVar169);
  auVar152 = vfnmadd213ps_fma(auVar142,auVar119,auVar183);
  auVar152 = vfmadd132ps_fma(ZEXT1632(auVar152),auVar119,auVar119);
  auVar20 = vfnmadd213ps_fma(auVar169,auVar129,auVar183);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar129,auVar129);
  auVar142 = vrcpps_avx(auVar111);
  auVar11 = vfnmadd213ps_fma(auVar111,auVar142,auVar183);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar142,auVar142);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar149));
  auVar119._4_4_ = auVar152._4_4_ * auVar111._4_4_;
  auVar119._0_4_ = auVar152._0_4_ * auVar111._0_4_;
  auVar119._8_4_ = auVar152._8_4_ * auVar111._8_4_;
  auVar119._12_4_ = auVar152._12_4_ * auVar111._12_4_;
  auVar119._16_4_ = auVar111._16_4_ * 0.0;
  auVar119._20_4_ = auVar111._20_4_ * 0.0;
  auVar119._24_4_ = auVar111._24_4_ * 0.0;
  auVar119._28_4_ = auVar111._28_4_;
  auVar159 = ZEXT3264(auVar119);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar149));
  auVar129._4_4_ = auVar152._4_4_ * auVar111._4_4_;
  auVar129._0_4_ = auVar152._0_4_ * auVar111._0_4_;
  auVar129._8_4_ = auVar152._8_4_ * auVar111._8_4_;
  auVar129._12_4_ = auVar152._12_4_ * auVar111._12_4_;
  auVar129._16_4_ = auVar111._16_4_ * 0.0;
  auVar129._20_4_ = auVar111._20_4_ * 0.0;
  auVar129._24_4_ = auVar111._24_4_ * 0.0;
  auVar129._28_4_ = auVar111._28_4_;
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0xe + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar13));
  auVar23._4_4_ = auVar20._4_4_ * auVar111._4_4_;
  auVar23._0_4_ = auVar20._0_4_ * auVar111._0_4_;
  auVar23._8_4_ = auVar20._8_4_ * auVar111._8_4_;
  auVar23._12_4_ = auVar20._12_4_ * auVar111._12_4_;
  auVar23._16_4_ = auVar111._16_4_ * 0.0;
  auVar23._20_4_ = auVar111._20_4_ * 0.0;
  auVar23._24_4_ = auVar111._24_4_ * 0.0;
  auVar23._28_4_ = auVar111._28_4_;
  auVar113._1_3_ = 0;
  auVar113[0] = PVar17;
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar17 * 0x10 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar13));
  auVar165._4_4_ = auVar20._4_4_ * auVar111._4_4_;
  auVar165._0_4_ = auVar20._0_4_ * auVar111._0_4_;
  auVar165._8_4_ = auVar20._8_4_ * auVar111._8_4_;
  auVar165._12_4_ = auVar20._12_4_ * auVar111._12_4_;
  auVar165._16_4_ = auVar111._16_4_ * 0.0;
  auVar165._20_4_ = auVar111._20_4_ * 0.0;
  auVar165._24_4_ = auVar111._24_4_ * 0.0;
  auVar165._28_4_ = auVar111._28_4_;
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x15 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar12));
  auVar24._4_4_ = auVar111._4_4_ * auVar11._4_4_;
  auVar24._0_4_ = auVar111._0_4_ * auVar11._0_4_;
  auVar24._8_4_ = auVar111._8_4_ * auVar11._8_4_;
  auVar24._12_4_ = auVar111._12_4_ * auVar11._12_4_;
  auVar24._16_4_ = auVar111._16_4_ * 0.0;
  auVar24._20_4_ = auVar111._20_4_ * 0.0;
  auVar24._24_4_ = auVar111._24_4_ * 0.0;
  auVar24._28_4_ = auVar111._28_4_;
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x17 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar12));
  auVar121._4_4_ = auVar11._4_4_ * auVar111._4_4_;
  auVar121._0_4_ = auVar11._0_4_ * auVar111._0_4_;
  auVar121._8_4_ = auVar11._8_4_ * auVar111._8_4_;
  auVar121._12_4_ = auVar11._12_4_ * auVar111._12_4_;
  auVar121._16_4_ = auVar111._16_4_ * 0.0;
  auVar121._20_4_ = auVar111._20_4_ * 0.0;
  auVar121._24_4_ = auVar111._24_4_ * 0.0;
  auVar121._28_4_ = auVar111._28_4_;
  auVar111 = vpminsd_avx2(auVar119,auVar129);
  auVar142 = vpminsd_avx2(auVar23,auVar165);
  auVar111 = vmaxps_avx(auVar111,auVar142);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar180._4_4_ = uVar104;
  auVar180._0_4_ = uVar104;
  auVar180._8_4_ = uVar104;
  auVar180._12_4_ = uVar104;
  auVar180._16_4_ = uVar104;
  auVar180._20_4_ = uVar104;
  auVar180._24_4_ = uVar104;
  auVar180._28_4_ = uVar104;
  auVar142 = vpminsd_avx2(auVar24,auVar121);
  auVar142 = vmaxps_avx(auVar142,auVar180);
  auVar111 = vmaxps_avx(auVar111,auVar142);
  local_80._4_4_ = auVar111._4_4_ * 0.99999964;
  local_80._0_4_ = auVar111._0_4_ * 0.99999964;
  local_80._8_4_ = auVar111._8_4_ * 0.99999964;
  local_80._12_4_ = auVar111._12_4_ * 0.99999964;
  local_80._16_4_ = auVar111._16_4_ * 0.99999964;
  local_80._20_4_ = auVar111._20_4_ * 0.99999964;
  local_80._24_4_ = auVar111._24_4_ * 0.99999964;
  local_80._28_4_ = auVar142._28_4_;
  auVar111 = vpmaxsd_avx2(auVar119,auVar129);
  auVar142 = vpmaxsd_avx2(auVar23,auVar165);
  auVar111 = vminps_avx(auVar111,auVar142);
  auVar142 = vpmaxsd_avx2(auVar24,auVar121);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar124._4_4_ = uVar104;
  auVar124._0_4_ = uVar104;
  auVar124._8_4_ = uVar104;
  auVar124._12_4_ = uVar104;
  auVar124._16_4_ = uVar104;
  auVar124._20_4_ = uVar104;
  auVar124._24_4_ = uVar104;
  auVar124._28_4_ = uVar104;
  auVar142 = vminps_avx(auVar142,auVar124);
  auVar111 = vminps_avx(auVar111,auVar142);
  auVar22._4_4_ = auVar111._4_4_ * 1.0000004;
  auVar22._0_4_ = auVar111._0_4_ * 1.0000004;
  auVar22._8_4_ = auVar111._8_4_ * 1.0000004;
  auVar22._12_4_ = auVar111._12_4_ * 1.0000004;
  auVar22._16_4_ = auVar111._16_4_ * 1.0000004;
  auVar22._20_4_ = auVar111._20_4_ * 1.0000004;
  auVar22._24_4_ = auVar111._24_4_ * 1.0000004;
  auVar22._28_4_ = auVar111._28_4_;
  auVar113[4] = PVar17;
  auVar113._5_3_ = 0;
  auVar113[8] = PVar17;
  auVar113._9_3_ = 0;
  auVar113[0xc] = PVar17;
  auVar113._13_3_ = 0;
  auVar113[0x10] = PVar17;
  auVar113._17_3_ = 0;
  auVar113[0x14] = PVar17;
  auVar113._21_3_ = 0;
  auVar113[0x18] = PVar17;
  auVar113._25_3_ = 0;
  auVar113[0x1c] = PVar17;
  auVar113._29_3_ = 0;
  auVar142 = vpcmpgtd_avx2(auVar113,_DAT_01fb4ba0);
  auVar111 = vcmpps_avx(local_80,auVar22,2);
  auVar111 = vandps_avx(auVar111,auVar142);
  uVar104 = vmovmskps_avx(auVar111);
  local_5c8 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar104);
  local_5d0 = pre->ray_space + k;
  local_5c0 = mm_lookupmask_ps._16_8_;
  uStack_5b8 = mm_lookupmask_ps._24_8_;
  uStack_5b0 = mm_lookupmask_ps._16_8_;
  uStack_5a8 = mm_lookupmask_ps._24_8_;
  iVar96 = 1 << ((uint)k & 0x1f);
  auVar111._4_4_ = iVar96;
  auVar111._0_4_ = iVar96;
  auVar111._8_4_ = iVar96;
  auVar111._12_4_ = iVar96;
  auVar111._16_4_ = iVar96;
  auVar111._20_4_ = iVar96;
  auVar111._24_4_ = iVar96;
  auVar111._28_4_ = iVar96;
  auVar142 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar111 = vpand_avx2(auVar111,auVar142);
  local_440 = vpcmpeqd_avx2(auVar111,auVar142);
  while (local_5c8 != 0) {
    local_680 = auVar159._0_32_;
    lVar105 = 0;
    for (uVar102 = local_5c8; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
      lVar105 = lVar105 + 1;
    }
    uVar97 = *(uint *)(prim + 2);
    uStack_718._0_4_ = *(uint *)(prim + lVar105 * 4 + 6);
    pGVar18 = (context->scene->geometries).items[uVar97].ptr;
    uVar102 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                              pGVar18[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)(uint)uStack_718);
    p_Var19 = pGVar18[1].intersectionFilterN;
    lVar105 = *(long *)&pGVar18[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar105 + (long)p_Var19 * uVar102);
    uVar160 = *(undefined8 *)*pauVar1;
    uVar86 = *(undefined8 *)(*pauVar1 + 8);
    auVar14 = *pauVar1;
    auVar11 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(lVar105 + (uVar102 + 1) * (long)p_Var19);
    uVar87 = *(undefined8 *)*pauVar2;
    uVar88 = *(undefined8 *)(*pauVar2 + 8);
    auVar13 = *pauVar2;
    auVar20 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(lVar105 + (uVar102 + 2) * (long)p_Var19);
    uVar89 = *(undefined8 *)*pauVar3;
    uVar90 = *(undefined8 *)(*pauVar3 + 8);
    auVar12 = *pauVar3;
    auVar152 = *pauVar3;
    uVar106 = local_5c8 - 1 & local_5c8;
    pauVar4 = (undefined1 (*) [12])(lVar105 + (uVar102 + 3) * (long)p_Var19);
    local_6b0 = (float)*(undefined8 *)*pauVar4;
    fStack_6ac = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_6a8 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_6a4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    uVar102 = uVar106 - 1;
    if (uVar106 != 0) {
      uVar102 = uVar102 & uVar106;
      for (uVar98 = uVar106; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
      }
      uVar98 = uVar102;
      if (uVar102 != 0) {
        for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar149 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar108 = vinsertps_avx(auVar149,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    iVar96 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar15 = vsubps_avx(*pauVar1,auVar108);
    uVar104 = auVar15._0_4_;
    auVar147._4_4_ = uVar104;
    auVar147._0_4_ = uVar104;
    auVar147._8_4_ = uVar104;
    auVar147._12_4_ = uVar104;
    auVar149 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    aVar9 = (local_5d0->vx).field_0;
    aVar10 = (local_5d0->vy).field_0;
    fVar133 = (local_5d0->vz).field_0.m128[0];
    fVar132 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
    fVar170 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
    fVar171 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
    auVar176._0_4_ = fVar133 * auVar15._0_4_;
    auVar176._4_4_ = fVar132 * auVar15._4_4_;
    auVar176._8_4_ = fVar170 * auVar15._8_4_;
    auVar176._12_4_ = fVar171 * auVar15._12_4_;
    auVar149 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar10,auVar149);
    auVar147 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar9,auVar147);
    auVar149 = vblendps_avx(auVar147,*pauVar1,8);
    auVar16 = vsubps_avx(*pauVar2,auVar108);
    uVar104 = auVar16._0_4_;
    auVar177._4_4_ = uVar104;
    auVar177._0_4_ = uVar104;
    auVar177._8_4_ = uVar104;
    auVar177._12_4_ = uVar104;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar198._0_4_ = fVar133 * auVar16._0_4_;
    auVar198._4_4_ = fVar132 * auVar16._4_4_;
    auVar198._8_4_ = fVar170 * auVar16._8_4_;
    auVar198._12_4_ = fVar171 * auVar16._12_4_;
    auVar15 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar10,auVar15);
    auVar176 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar9,auVar177);
    auVar15 = vblendps_avx(auVar176,*pauVar2,8);
    auVar161 = vsubps_avx(*pauVar3,auVar108);
    uVar104 = auVar161._0_4_;
    auVar187._4_4_ = uVar104;
    auVar187._0_4_ = uVar104;
    auVar187._8_4_ = uVar104;
    auVar187._12_4_ = uVar104;
    auVar16 = vshufps_avx(auVar161,auVar161,0x55);
    auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar202._0_4_ = fVar133 * auVar161._0_4_;
    auVar202._4_4_ = fVar132 * auVar161._4_4_;
    auVar202._8_4_ = fVar170 * auVar161._8_4_;
    auVar202._12_4_ = fVar171 * auVar161._12_4_;
    auVar16 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar10,auVar16);
    auVar177 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar9,auVar187);
    auVar16 = vblendps_avx(auVar177,*pauVar3,8);
    auVar25._12_4_ = fStack_6a4;
    auVar25._0_12_ = *pauVar4;
    auVar161 = vsubps_avx(auVar25,auVar108);
    uVar104 = auVar161._0_4_;
    auVar188._4_4_ = uVar104;
    auVar188._0_4_ = uVar104;
    auVar188._8_4_ = uVar104;
    auVar188._12_4_ = uVar104;
    auVar108 = vshufps_avx(auVar161,auVar161,0x55);
    auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar206._0_4_ = fVar133 * auVar161._0_4_;
    auVar206._4_4_ = fVar132 * auVar161._4_4_;
    auVar206._8_4_ = fVar170 * auVar161._8_4_;
    auVar206._12_4_ = fVar171 * auVar161._12_4_;
    auVar108 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar10,auVar108);
    auVar187 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar9,auVar188);
    auVar108 = vblendps_avx(auVar187,auVar25,8);
    auVar123._8_4_ = 0x7fffffff;
    auVar123._0_8_ = 0x7fffffff7fffffff;
    auVar123._12_4_ = 0x7fffffff;
    auVar149 = vandps_avx(auVar149,auVar123);
    auVar15 = vandps_avx(auVar15,auVar123);
    auVar161 = vmaxps_avx(auVar149,auVar15);
    auVar149 = vandps_avx(auVar16,auVar123);
    auVar15 = vandps_avx(auVar108,auVar123);
    auVar149 = vmaxps_avx(auVar149,auVar15);
    auVar149 = vmaxps_avx(auVar161,auVar149);
    auVar15 = vmovshdup_avx(auVar149);
    auVar15 = vmaxss_avx(auVar15,auVar149);
    auVar149 = vshufpd_avx(auVar149,auVar149,1);
    auVar149 = vmaxss_avx(auVar149,auVar15);
    lVar105 = (long)iVar96 * 0x44;
    auVar15 = vmovshdup_avx(auVar147);
    uVar107 = auVar15._0_8_;
    local_620._8_8_ = uVar107;
    local_620._0_8_ = uVar107;
    local_620._16_8_ = uVar107;
    local_620._24_8_ = uVar107;
    auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar105 + 0x484);
    auVar15 = vmovshdup_avx(auVar176);
    uVar107 = auVar15._0_8_;
    local_540._8_8_ = uVar107;
    local_540._0_8_ = uVar107;
    local_540._16_8_ = uVar107;
    local_540._24_8_ = uVar107;
    auVar142 = *(undefined1 (*) [32])(bspline_basis0 + lVar105 + 0x908);
    uVar201 = auVar177._0_4_;
    auVar139._4_4_ = uVar201;
    auVar139._0_4_ = uVar201;
    auVar139._8_4_ = uVar201;
    auVar139._12_4_ = uVar201;
    auVar139._16_4_ = uVar201;
    auVar139._20_4_ = uVar201;
    auVar139._24_4_ = uVar201;
    auVar139._28_4_ = uVar201;
    auVar15 = vmovshdup_avx(auVar177);
    uVar107 = auVar15._0_8_;
    auVar163._8_8_ = uVar107;
    auVar163._0_8_ = uVar107;
    auVar163._16_8_ = uVar107;
    auVar163._24_8_ = uVar107;
    fVar132 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar105 + 0xd8c);
    fVar170 = *(float *)(bspline_basis0 + lVar105 + 0xd90);
    fVar171 = *(float *)(bspline_basis0 + lVar105 + 0xd94);
    fVar172 = *(float *)(bspline_basis0 + lVar105 + 0xd98);
    fVar173 = *(float *)(bspline_basis0 + lVar105 + 0xd9c);
    fVar174 = *(float *)(bspline_basis0 + lVar105 + 0xda0);
    fVar175 = *(float *)(bspline_basis0 + lVar105 + 0xda4);
    auVar92 = *(undefined1 (*) [28])(bspline_basis0 + lVar105 + 0xd8c);
    fVar204 = auVar187._0_4_;
    auVar15 = vmovshdup_avx(auVar187);
    uVar107 = auVar15._0_8_;
    auVar178._0_4_ = fVar132 * fVar204;
    auVar178._4_4_ = fVar170 * fVar204;
    auVar178._8_4_ = fVar171 * fVar204;
    auVar178._12_4_ = fVar172 * fVar204;
    auVar178._16_4_ = fVar173 * fVar204;
    auVar178._20_4_ = fVar174 * fVar204;
    auVar178._24_4_ = fVar175 * fVar204;
    auVar178._28_4_ = 0;
    fVar222 = auVar15._0_4_;
    auVar112._0_4_ = fVar222 * fVar132;
    fVar225 = auVar15._4_4_;
    auVar112._4_4_ = fVar225 * fVar170;
    auVar112._8_4_ = fVar222 * fVar171;
    auVar112._12_4_ = fVar225 * fVar172;
    auVar112._16_4_ = fVar222 * fVar173;
    auVar112._20_4_ = fVar225 * fVar174;
    auVar112._24_4_ = fVar222 * fVar175;
    auVar112._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar178,auVar142,auVar139);
    auVar16 = vfmadd231ps_fma(auVar112,auVar142,auVar163);
    uVar104 = auVar176._0_4_;
    auVar214._4_4_ = uVar104;
    auVar214._0_4_ = uVar104;
    auVar214._8_4_ = uVar104;
    auVar214._12_4_ = uVar104;
    auVar214._16_4_ = uVar104;
    auVar214._20_4_ = uVar104;
    auVar214._24_4_ = uVar104;
    auVar214._28_4_ = uVar104;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar111,auVar214);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar111,local_540);
    auVar169 = *(undefined1 (*) [32])(bspline_basis0 + lVar105);
    uVar104 = auVar147._0_4_;
    auVar155._4_4_ = uVar104;
    auVar155._0_4_ = uVar104;
    auVar155._8_4_ = uVar104;
    auVar155._12_4_ = uVar104;
    auVar155._16_4_ = uVar104;
    auVar155._20_4_ = uVar104;
    auVar155._24_4_ = uVar104;
    auVar155._28_4_ = uVar104;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar169,auVar155);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar169,local_620);
    auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar105 + 0x908);
    fVar205 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar105 + 0xd8c);
    fVar210 = *(float *)(bspline_basis1 + lVar105 + 0xd90);
    fVar81 = *(float *)(bspline_basis1 + lVar105 + 0xd94);
    fVar82 = *(float *)(bspline_basis1 + lVar105 + 0xd98);
    fVar83 = *(float *)(bspline_basis1 + lVar105 + 0xd9c);
    fVar84 = *(float *)(bspline_basis1 + lVar105 + 0xda0);
    fVar85 = *(float *)(bspline_basis1 + lVar105 + 0xda4);
    auVar93 = *(undefined1 (*) [28])(bspline_basis1 + lVar105 + 0xd8c);
    auVar27._4_4_ = fVar210 * fVar204;
    auVar27._0_4_ = fVar205 * fVar204;
    auVar27._8_4_ = fVar81 * fVar204;
    auVar27._12_4_ = fVar82 * fVar204;
    auVar27._16_4_ = fVar83 * fVar204;
    auVar27._20_4_ = fVar84 * fVar204;
    auVar27._24_4_ = fVar85 * fVar204;
    auVar27._28_4_ = fVar204;
    auVar108 = vfmadd231ps_fma(auVar27,auVar119,auVar139);
    auVar28._4_4_ = fVar225 * fVar210;
    auVar28._0_4_ = fVar222 * fVar205;
    auVar28._8_4_ = fVar222 * fVar81;
    auVar28._12_4_ = fVar225 * fVar82;
    auVar28._16_4_ = fVar222 * fVar83;
    auVar28._20_4_ = fVar225 * fVar84;
    auVar28._24_4_ = fVar222 * fVar85;
    auVar28._28_4_ = uVar201;
    auVar161 = vfmadd231ps_fma(auVar28,auVar119,auVar163);
    auVar129 = *(undefined1 (*) [32])(bspline_basis1 + lVar105 + 0x484);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar129,auVar214);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar129,local_540);
    auVar23 = *(undefined1 (*) [32])(bspline_basis1 + lVar105);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar23,auVar155);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar23,local_620);
    auVar124 = ZEXT1632(auVar108);
    local_480 = ZEXT1632(auVar15);
    auVar121 = vsubps_avx(auVar124,local_480);
    _local_460 = ZEXT1632(auVar161);
    auVar113 = ZEXT1632(auVar16);
    auVar21 = vsubps_avx(_local_460,auVar113);
    auVar114._0_4_ = auVar16._0_4_ * auVar121._0_4_;
    auVar114._4_4_ = auVar16._4_4_ * auVar121._4_4_;
    auVar114._8_4_ = auVar16._8_4_ * auVar121._8_4_;
    auVar114._12_4_ = auVar16._12_4_ * auVar121._12_4_;
    auVar114._16_4_ = auVar121._16_4_ * 0.0;
    auVar114._20_4_ = auVar121._20_4_ * 0.0;
    auVar114._24_4_ = auVar121._24_4_ * 0.0;
    auVar114._28_4_ = 0;
    fVar213 = auVar21._0_4_;
    auVar125._0_4_ = fVar213 * auVar15._0_4_;
    fVar216 = auVar21._4_4_;
    auVar125._4_4_ = fVar216 * auVar15._4_4_;
    fVar217 = auVar21._8_4_;
    auVar125._8_4_ = fVar217 * auVar15._8_4_;
    fVar218 = auVar21._12_4_;
    auVar125._12_4_ = fVar218 * auVar15._12_4_;
    fVar219 = auVar21._16_4_;
    auVar125._16_4_ = fVar219 * 0.0;
    fVar220 = auVar21._20_4_;
    auVar125._20_4_ = fVar220 * 0.0;
    fVar221 = auVar21._24_4_;
    auVar125._24_4_ = fVar221 * 0.0;
    auVar125._28_4_ = 0;
    auVar24 = vsubps_avx(auVar114,auVar125);
    auVar15 = vpermilps_avx(*pauVar1,0xff);
    uVar122 = auVar15._0_8_;
    local_a0._8_8_ = uVar122;
    local_a0._0_8_ = uVar122;
    local_a0._16_8_ = uVar122;
    local_a0._24_8_ = uVar122;
    auVar16 = vpermilps_avx(*pauVar2,0xff);
    uVar122 = auVar16._0_8_;
    local_c0._8_8_ = uVar122;
    local_c0._0_8_ = uVar122;
    local_c0._16_8_ = uVar122;
    local_c0._24_8_ = uVar122;
    auVar16 = vpermilps_avx(*pauVar3,0xff);
    uVar122 = auVar16._0_8_;
    local_e0._8_8_ = uVar122;
    local_e0._0_8_ = uVar122;
    local_e0._16_8_ = uVar122;
    local_e0._24_8_ = uVar122;
    auVar26._12_4_ = fStack_6a4;
    auVar26._0_12_ = *pauVar4;
    auVar16 = vpermilps_avx(auVar26,0xff);
    local_100 = auVar16._0_8_;
    fVar133 = auVar16._0_4_;
    auVar179._0_4_ = fVar132 * fVar133;
    fVar132 = auVar16._4_4_;
    auVar179._4_4_ = fVar170 * fVar132;
    auVar179._8_4_ = fVar171 * fVar133;
    auVar179._12_4_ = fVar172 * fVar132;
    auVar179._16_4_ = fVar173 * fVar133;
    auVar179._20_4_ = fVar174 * fVar132;
    auVar179._24_4_ = fVar175 * fVar133;
    auVar179._28_4_ = 0;
    auVar16 = vfmadd231ps_fma(auVar179,local_e0,auVar142);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_c0,auVar111);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar169,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar29._4_4_ = fVar210 * fVar132;
    auVar29._0_4_ = fVar205 * fVar133;
    auVar29._8_4_ = fVar81 * fVar133;
    auVar29._12_4_ = fVar82 * fVar132;
    auVar29._16_4_ = fVar83 * fVar133;
    auVar29._20_4_ = fVar84 * fVar132;
    auVar29._24_4_ = fVar85 * fVar133;
    auVar29._28_4_ = auVar169._28_4_;
    auVar16 = vfmadd231ps_fma(auVar29,auVar119,local_e0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar129,local_c0);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar23,local_a0);
    auVar30._4_4_ = fVar216 * fVar216;
    auVar30._0_4_ = fVar213 * fVar213;
    auVar30._8_4_ = fVar217 * fVar217;
    auVar30._12_4_ = fVar218 * fVar218;
    auVar30._16_4_ = fVar219 * fVar219;
    auVar30._20_4_ = fVar220 * fVar220;
    auVar30._24_4_ = fVar221 * fVar221;
    auVar30._28_4_ = auVar15._4_4_;
    auVar15 = vfmadd231ps_fma(auVar30,auVar121,auVar121);
    auVar165 = vmaxps_avx(ZEXT1632(auVar108),ZEXT1632(auVar161));
    auVar31._4_4_ = auVar165._4_4_ * auVar165._4_4_ * auVar15._4_4_;
    auVar31._0_4_ = auVar165._0_4_ * auVar165._0_4_ * auVar15._0_4_;
    auVar31._8_4_ = auVar165._8_4_ * auVar165._8_4_ * auVar15._8_4_;
    auVar31._12_4_ = auVar165._12_4_ * auVar165._12_4_ * auVar15._12_4_;
    auVar31._16_4_ = auVar165._16_4_ * auVar165._16_4_ * 0.0;
    auVar31._20_4_ = auVar165._20_4_ * auVar165._20_4_ * 0.0;
    auVar31._24_4_ = auVar165._24_4_ * auVar165._24_4_ * 0.0;
    auVar31._28_4_ = auVar165._28_4_;
    auVar32._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar32._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar32._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar32._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar32._16_4_ = auVar24._16_4_ * auVar24._16_4_;
    auVar32._20_4_ = auVar24._20_4_ * auVar24._20_4_;
    auVar32._24_4_ = auVar24._24_4_ * auVar24._24_4_;
    auVar32._28_4_ = auVar24._28_4_;
    auVar165 = vcmpps_avx(auVar32,auVar31,2);
    fVar133 = auVar149._0_4_ * 4.7683716e-07;
    auVar115._0_4_ = (float)iVar96;
    register0x000014c4 = auVar177._4_12_;
    auVar115._4_4_ = auVar115._0_4_;
    auVar115._8_4_ = auVar115._0_4_;
    auVar115._12_4_ = auVar115._0_4_;
    auVar115._16_4_ = auVar115._0_4_;
    auVar115._20_4_ = auVar115._0_4_;
    auVar115._24_4_ = auVar115._0_4_;
    auVar115._28_4_ = auVar115._0_4_;
    auVar24 = vcmpps_avx(_DAT_01f7b060,auVar115,1);
    auVar15 = vpermilps_avx(auVar147,0xaa);
    uVar122 = auVar15._0_8_;
    local_580._8_8_ = uVar122;
    local_580._0_8_ = uVar122;
    local_580._16_8_ = uVar122;
    local_580._24_8_ = uVar122;
    auVar16 = vpermilps_avx(auVar176,0xaa);
    uVar122 = auVar16._0_8_;
    auVar212._8_8_ = uVar122;
    auVar212._0_8_ = uVar122;
    auVar212._16_8_ = uVar122;
    auVar212._24_8_ = uVar122;
    auVar149 = vshufps_avx(auVar177,auVar177,0xaa);
    uVar122 = auVar149._0_8_;
    local_3c0._8_8_ = uVar122;
    local_3c0._0_8_ = uVar122;
    local_3c0._16_8_ = uVar122;
    local_3c0._24_8_ = uVar122;
    auVar149 = vshufps_avx(auVar187,auVar187,0xaa);
    uVar122 = auVar149._0_8_;
    register0x00001508 = uVar122;
    local_6a0 = uVar122;
    register0x00001510 = uVar122;
    register0x00001518 = uVar122;
    auVar209 = ZEXT3264(_local_6a0);
    auVar22 = auVar24 & auVar165;
    uVar8 = *(uint *)(ray + k * 4 + 0x60);
    local_640._0_16_ = ZEXT416(uVar8);
    local_520 = ZEXT416((uint)uStack_718);
    local_500._0_4_ = auVar115._0_4_;
    local_520._0_4_ = (uint)uStack_718;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0x7f,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar22 >> 0xbf,0) == '\0') &&
        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f]) {
      uVar102 = 0;
      auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,CONCAT416(fVar204,
                                                  CONCAT412(fVar204,CONCAT48(fVar204,CONCAT44(
                                                  fVar204,fVar204))))))));
      auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(fVar222,
                                                  CONCAT412(fVar225,CONCAT48(fVar222,uVar107)))))));
    }
    else {
      _local_4a0 = vandps_avx(auVar165,auVar24);
      local_560._0_4_ = auVar93._0_4_;
      local_560._4_4_ = auVar93._4_4_;
      fStack_558 = auVar93._8_4_;
      fStack_554 = auVar93._12_4_;
      fStack_550 = auVar93._16_4_;
      fStack_54c = auVar93._20_4_;
      fStack_548 = auVar93._24_4_;
      fVar205 = auVar149._0_4_;
      fVar210 = auVar149._4_4_;
      auVar33._4_4_ = fVar210 * (float)local_560._4_4_;
      auVar33._0_4_ = fVar205 * (float)local_560._0_4_;
      auVar33._8_4_ = fVar205 * fStack_558;
      auVar33._12_4_ = fVar210 * fStack_554;
      auVar33._16_4_ = fVar205 * fStack_550;
      auVar33._20_4_ = fVar210 * fStack_54c;
      auVar33._24_4_ = fVar205 * fStack_548;
      auVar33._28_4_ = local_4a0._28_4_;
      auVar149 = vfmadd213ps_fma(auVar119,local_3c0,auVar33);
      auVar149 = vfmadd213ps_fma(auVar129,auVar212,ZEXT1632(auVar149));
      auVar149 = vfmadd213ps_fma(auVar23,local_580,ZEXT1632(auVar149));
      _local_560 = ZEXT1632(auVar149);
      local_5a0._0_4_ = auVar92._0_4_;
      local_5a0._4_4_ = auVar92._4_4_;
      fStack_598 = auVar92._8_4_;
      fStack_594 = auVar92._12_4_;
      fStack_590 = auVar92._16_4_;
      fStack_58c = auVar92._20_4_;
      fStack_588 = auVar92._24_4_;
      auVar34._4_4_ = fVar210 * (float)local_5a0._4_4_;
      auVar34._0_4_ = fVar205 * (float)local_5a0._0_4_;
      auVar34._8_4_ = fVar205 * fStack_598;
      auVar34._12_4_ = fVar210 * fStack_594;
      auVar34._16_4_ = fVar205 * fStack_590;
      auVar34._20_4_ = fVar210 * fStack_58c;
      auVar34._24_4_ = fVar205 * fStack_588;
      auVar34._28_4_ = local_4a0._28_4_;
      auVar149 = vfmadd213ps_fma(auVar142,local_3c0,auVar34);
      auVar149 = vfmadd213ps_fma(auVar111,auVar212,ZEXT1632(auVar149));
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar105 + 0x1210);
      auVar142 = *(undefined1 (*) [32])(bspline_basis0 + lVar105 + 0x1694);
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar105 + 0x1b18);
      fVar132 = *(float *)(bspline_basis0 + lVar105 + 0x1f9c);
      fVar170 = *(float *)(bspline_basis0 + lVar105 + 0x1fa0);
      fVar171 = *(float *)(bspline_basis0 + lVar105 + 0x1fa4);
      fVar172 = *(float *)(bspline_basis0 + lVar105 + 0x1fa8);
      fVar173 = *(float *)(bspline_basis0 + lVar105 + 0x1fac);
      fVar174 = *(float *)(bspline_basis0 + lVar105 + 0x1fb0);
      fVar175 = *(float *)(bspline_basis0 + lVar105 + 0x1fb4);
      auVar164._0_4_ = fVar132 * fVar204;
      auVar164._4_4_ = fVar170 * fVar204;
      auVar164._8_4_ = fVar171 * fVar204;
      auVar164._12_4_ = fVar172 * fVar204;
      auVar164._16_4_ = fVar173 * fVar204;
      auVar164._20_4_ = fVar174 * fVar204;
      auVar164._24_4_ = fVar175 * fVar204;
      auVar164._28_4_ = 0;
      auVar193._0_4_ = fVar222 * fVar132;
      auVar193._4_4_ = fVar225 * fVar170;
      auVar193._8_4_ = fVar222 * fVar171;
      auVar193._12_4_ = fVar225 * fVar172;
      auVar193._16_4_ = fVar222 * fVar173;
      auVar193._20_4_ = fVar225 * fVar174;
      auVar193._24_4_ = fVar222 * fVar175;
      auVar193._28_4_ = 0;
      auVar199._0_4_ = fVar205 * fVar132;
      auVar199._4_4_ = fVar210 * fVar170;
      auVar199._8_4_ = fVar205 * fVar171;
      auVar199._12_4_ = fVar210 * fVar172;
      auVar199._16_4_ = fVar205 * fVar173;
      auVar199._20_4_ = fVar210 * fVar174;
      auVar199._24_4_ = fVar205 * fVar175;
      auVar199._28_4_ = 0;
      auVar147 = vfmadd231ps_fma(auVar164,auVar119,auVar139);
      auVar176 = vfmadd231ps_fma(auVar193,auVar119,auVar163);
      auVar177 = vfmadd231ps_fma(auVar199,local_3c0,auVar119);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar142,auVar214);
      auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar142,local_540);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar142,auVar212);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar111,auVar155);
      auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar111,local_620);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),local_580,auVar111);
      fVar132 = *(float *)(bspline_basis1 + lVar105 + 0x1f9c);
      fVar170 = *(float *)(bspline_basis1 + lVar105 + 0x1fa0);
      fVar171 = *(float *)(bspline_basis1 + lVar105 + 0x1fa4);
      fVar172 = *(float *)(bspline_basis1 + lVar105 + 0x1fa8);
      fVar173 = *(float *)(bspline_basis1 + lVar105 + 0x1fac);
      fVar174 = *(float *)(bspline_basis1 + lVar105 + 0x1fb0);
      fVar175 = *(float *)(bspline_basis1 + lVar105 + 0x1fb4);
      auVar142._4_4_ = fVar170 * fVar204;
      auVar142._0_4_ = fVar132 * fVar204;
      auVar142._8_4_ = fVar171 * fVar204;
      auVar142._12_4_ = fVar172 * fVar204;
      auVar142._16_4_ = fVar173 * fVar204;
      auVar142._20_4_ = fVar174 * fVar204;
      auVar142._24_4_ = fVar175 * fVar204;
      auVar142._28_4_ = auVar111._28_4_;
      auVar35._4_4_ = fVar225 * fVar170;
      auVar35._0_4_ = fVar222 * fVar132;
      auVar35._8_4_ = fVar222 * fVar171;
      auVar35._12_4_ = fVar225 * fVar172;
      auVar35._16_4_ = fVar222 * fVar173;
      auVar35._20_4_ = fVar225 * fVar174;
      auVar35._24_4_ = fVar222 * fVar175;
      auVar35._28_4_ = fVar210;
      auVar36._4_4_ = fVar210 * fVar170;
      auVar36._0_4_ = fVar205 * fVar132;
      auVar36._8_4_ = fVar205 * fVar171;
      auVar36._12_4_ = fVar210 * fVar172;
      auVar36._16_4_ = fVar205 * fVar173;
      auVar36._20_4_ = fVar210 * fVar174;
      auVar36._24_4_ = fVar205 * fVar175;
      auVar36._28_4_ = auVar15._4_4_;
      auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar105 + 0x1b18);
      auVar15 = vfmadd231ps_fma(auVar142,auVar111,auVar139);
      auVar187 = vfmadd231ps_fma(auVar35,auVar111,auVar163);
      auVar25 = vfmadd231ps_fma(auVar36,auVar111,local_3c0);
      auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar105 + 0x1694);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar111,auVar214);
      auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar111,local_540);
      auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar212,auVar111);
      auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar105 + 0x1210);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar111,auVar155);
      auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar111,local_620);
      auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),local_580,auVar111);
      auVar111 = vandps_avx(local_420,ZEXT1632(auVar147));
      auVar142 = vandps_avx(ZEXT1632(auVar176),local_420);
      auVar142 = vmaxps_avx(auVar111,auVar142);
      auVar111 = vandps_avx(ZEXT1632(auVar177),local_420);
      auVar111 = vmaxps_avx(auVar142,auVar111);
      auVar126._4_4_ = fVar133;
      auVar126._0_4_ = fVar133;
      auVar126._8_4_ = fVar133;
      auVar126._12_4_ = fVar133;
      auVar126._16_4_ = fVar133;
      auVar126._20_4_ = fVar133;
      auVar126._24_4_ = fVar133;
      auVar126._28_4_ = fVar133;
      auVar111 = vcmpps_avx(auVar111,auVar126,1);
      auVar119 = vblendvps_avx(ZEXT1632(auVar147),auVar121,auVar111);
      auVar129 = vblendvps_avx(ZEXT1632(auVar176),auVar21,auVar111);
      auVar111 = vandps_avx(ZEXT1632(auVar15),local_420);
      auVar142 = vandps_avx(ZEXT1632(auVar187),local_420);
      auVar142 = vmaxps_avx(auVar111,auVar142);
      auVar111 = vandps_avx(ZEXT1632(auVar25),local_420);
      auVar111 = vmaxps_avx(auVar142,auVar111);
      auVar142 = vcmpps_avx(auVar111,auVar126,1);
      auVar111 = vblendvps_avx(ZEXT1632(auVar15),auVar121,auVar142);
      auVar142 = vblendvps_avx(ZEXT1632(auVar187),auVar21,auVar142);
      auVar149 = vfmadd213ps_fma(auVar169,local_580,ZEXT1632(auVar149));
      auVar15 = vfmadd213ps_fma(auVar119,auVar119,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar129,auVar129);
      auVar169 = vrsqrtps_avx(ZEXT1632(auVar15));
      fVar132 = auVar169._0_4_;
      fVar170 = auVar169._4_4_;
      fVar171 = auVar169._8_4_;
      fVar172 = auVar169._12_4_;
      fVar173 = auVar169._16_4_;
      fVar174 = auVar169._20_4_;
      fVar175 = auVar169._24_4_;
      auVar37._4_4_ = fVar170 * fVar170 * fVar170 * auVar15._4_4_ * -0.5;
      auVar37._0_4_ = fVar132 * fVar132 * fVar132 * auVar15._0_4_ * -0.5;
      auVar37._8_4_ = fVar171 * fVar171 * fVar171 * auVar15._8_4_ * -0.5;
      auVar37._12_4_ = fVar172 * fVar172 * fVar172 * auVar15._12_4_ * -0.5;
      auVar37._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar37._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
      auVar37._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar37._28_4_ = 0;
      auVar215._8_4_ = 0x3fc00000;
      auVar215._0_8_ = 0x3fc000003fc00000;
      auVar215._12_4_ = 0x3fc00000;
      auVar215._16_4_ = 0x3fc00000;
      auVar215._20_4_ = 0x3fc00000;
      auVar215._24_4_ = 0x3fc00000;
      auVar215._28_4_ = 0x3fc00000;
      auVar15 = vfmadd231ps_fma(auVar37,auVar215,auVar169);
      fVar132 = auVar15._0_4_;
      fVar170 = auVar15._4_4_;
      auVar38._4_4_ = auVar129._4_4_ * fVar170;
      auVar38._0_4_ = auVar129._0_4_ * fVar132;
      fVar171 = auVar15._8_4_;
      auVar38._8_4_ = auVar129._8_4_ * fVar171;
      fVar172 = auVar15._12_4_;
      auVar38._12_4_ = auVar129._12_4_ * fVar172;
      auVar38._16_4_ = auVar129._16_4_ * 0.0;
      auVar38._20_4_ = auVar129._20_4_ * 0.0;
      auVar38._24_4_ = auVar129._24_4_ * 0.0;
      auVar38._28_4_ = auVar169._28_4_;
      auVar39._4_4_ = -auVar119._4_4_ * fVar170;
      auVar39._0_4_ = -auVar119._0_4_ * fVar132;
      auVar39._8_4_ = -auVar119._8_4_ * fVar171;
      auVar39._12_4_ = -auVar119._12_4_ * fVar172;
      auVar39._16_4_ = -auVar119._16_4_ * 0.0;
      auVar39._20_4_ = -auVar119._20_4_ * 0.0;
      auVar39._24_4_ = -auVar119._24_4_ * 0.0;
      auVar39._28_4_ = auVar119._28_4_ ^ 0x80000000;
      auVar15 = vfmadd213ps_fma(auVar111,auVar111,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar142,auVar142);
      auVar169 = vrsqrtps_avx(ZEXT1632(auVar15));
      auVar119 = ZEXT1632(CONCAT412(fVar172 * 0.0,
                                    CONCAT48(fVar171 * 0.0,CONCAT44(fVar170 * 0.0,fVar132 * 0.0))));
      fVar132 = auVar169._0_4_;
      fVar170 = auVar169._4_4_;
      fVar171 = auVar169._8_4_;
      fVar172 = auVar169._12_4_;
      fVar173 = auVar169._16_4_;
      fVar174 = auVar169._20_4_;
      fVar175 = auVar169._24_4_;
      auVar40._4_4_ = fVar170 * fVar170 * auVar15._4_4_ * -0.5 * fVar170;
      auVar40._0_4_ = fVar132 * fVar132 * auVar15._0_4_ * -0.5 * fVar132;
      auVar40._8_4_ = fVar171 * fVar171 * auVar15._8_4_ * -0.5 * fVar171;
      auVar40._12_4_ = fVar172 * fVar172 * auVar15._12_4_ * -0.5 * fVar172;
      auVar40._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar40._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
      auVar40._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar40._28_4_ = 0xbf000000;
      auVar15 = vfmadd231ps_fma(auVar40,auVar215,auVar169);
      fVar132 = auVar15._0_4_;
      fVar170 = auVar15._4_4_;
      auVar41._4_4_ = fVar170 * auVar142._4_4_;
      auVar41._0_4_ = fVar132 * auVar142._0_4_;
      fVar171 = auVar15._8_4_;
      auVar41._8_4_ = fVar171 * auVar142._8_4_;
      fVar172 = auVar15._12_4_;
      auVar41._12_4_ = fVar172 * auVar142._12_4_;
      auVar41._16_4_ = auVar142._16_4_ * 0.0;
      auVar41._20_4_ = auVar142._20_4_ * 0.0;
      auVar41._24_4_ = auVar142._24_4_ * 0.0;
      auVar41._28_4_ = 0;
      auVar42._4_4_ = fVar170 * -auVar111._4_4_;
      auVar42._0_4_ = fVar132 * -auVar111._0_4_;
      auVar42._8_4_ = fVar171 * -auVar111._8_4_;
      auVar42._12_4_ = fVar172 * -auVar111._12_4_;
      auVar42._16_4_ = -auVar111._16_4_ * 0.0;
      auVar42._20_4_ = -auVar111._20_4_ * 0.0;
      auVar42._24_4_ = -auVar111._24_4_ * 0.0;
      auVar42._28_4_ = 0;
      auVar43._28_4_ = auVar169._28_4_;
      auVar43._0_28_ =
           ZEXT1628(CONCAT412(fVar172 * 0.0,
                              CONCAT48(fVar171 * 0.0,CONCAT44(fVar170 * 0.0,fVar132 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar108),local_480);
      auVar111 = ZEXT1632(auVar108);
      auVar147 = vfmadd213ps_fma(auVar39,auVar111,auVar113);
      auVar176 = vfmadd213ps_fma(auVar119,auVar111,ZEXT1632(auVar149));
      auVar25 = vfnmadd213ps_fma(auVar38,auVar111,local_480);
      auVar177 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar161),auVar124);
      auVar26 = vfnmadd213ps_fma(auVar39,auVar111,auVar113);
      auVar190 = ZEXT1632(auVar161);
      auVar161 = vfmadd213ps_fma(auVar42,auVar190,_local_460);
      auVar180 = ZEXT1632(auVar108);
      auVar198 = vfnmadd231ps_fma(ZEXT1632(auVar149),auVar180,auVar119);
      auVar108 = vfmadd213ps_fma(auVar43,auVar190,_local_560);
      auVar123 = vfnmadd213ps_fma(auVar41,auVar190,auVar124);
      auVar188 = vfnmadd213ps_fma(auVar42,auVar190,_local_460);
      auVar202 = vfnmadd231ps_fma(_local_560,auVar190,auVar43);
      auVar111 = vsubps_avx(ZEXT1632(auVar161),ZEXT1632(auVar26));
      auVar142 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar198));
      auVar140._0_4_ = auVar198._0_4_ * auVar111._0_4_;
      auVar140._4_4_ = auVar198._4_4_ * auVar111._4_4_;
      auVar140._8_4_ = auVar198._8_4_ * auVar111._8_4_;
      auVar140._12_4_ = auVar198._12_4_ * auVar111._12_4_;
      auVar140._16_4_ = auVar111._16_4_ * 0.0;
      auVar140._20_4_ = auVar111._20_4_ * 0.0;
      auVar140._24_4_ = auVar111._24_4_ * 0.0;
      auVar140._28_4_ = 0;
      auVar187 = vfmsub231ps_fma(auVar140,ZEXT1632(auVar26),auVar142);
      auVar44._4_4_ = auVar142._4_4_ * auVar25._4_4_;
      auVar44._0_4_ = auVar142._0_4_ * auVar25._0_4_;
      auVar44._8_4_ = auVar142._8_4_ * auVar25._8_4_;
      auVar44._12_4_ = auVar142._12_4_ * auVar25._12_4_;
      auVar44._16_4_ = auVar142._16_4_ * 0.0;
      auVar44._20_4_ = auVar142._20_4_ * 0.0;
      auVar44._24_4_ = auVar142._24_4_ * 0.0;
      auVar44._28_4_ = auVar142._28_4_;
      auVar142 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar25));
      auVar149 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar198),auVar142);
      auVar45._4_4_ = auVar26._4_4_ * auVar142._4_4_;
      auVar45._0_4_ = auVar26._0_4_ * auVar142._0_4_;
      auVar45._8_4_ = auVar26._8_4_ * auVar142._8_4_;
      auVar45._12_4_ = auVar26._12_4_ * auVar142._12_4_;
      auVar45._16_4_ = auVar142._16_4_ * 0.0;
      auVar45._20_4_ = auVar142._20_4_ * 0.0;
      auVar45._24_4_ = auVar142._24_4_ * 0.0;
      auVar45._28_4_ = auVar142._28_4_;
      auVar165 = ZEXT1632(auVar25);
      auVar25 = vfmsub231ps_fma(auVar45,auVar165,auVar111);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar25),ZEXT832(0) << 0x20,ZEXT1632(auVar149));
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),ZEXT832(0) << 0x20,ZEXT1632(auVar187));
      auVar22 = vcmpps_avx(ZEXT1632(auVar149),ZEXT832(0) << 0x20,2);
      auVar111 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar15),auVar22);
      auVar142 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar147),auVar22);
      auVar169 = vblendvps_avx(ZEXT1632(auVar202),ZEXT1632(auVar176),auVar22);
      auVar119 = vblendvps_avx(auVar165,ZEXT1632(auVar177),auVar22);
      auVar129 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar161),auVar22);
      auVar23 = vblendvps_avx(ZEXT1632(auVar198),ZEXT1632(auVar108),auVar22);
      auVar165 = vblendvps_avx(ZEXT1632(auVar177),auVar165,auVar22);
      auVar24 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar26),auVar22);
      auVar149 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
      auVar121 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar198),auVar22);
      auVar113 = vsubps_avx(auVar165,auVar111);
      auVar124 = vsubps_avx(auVar24,auVar142);
      auVar162 = vsubps_avx(auVar121,auVar169);
      auVar189 = vsubps_avx(auVar111,auVar119);
      auVar183 = vsubps_avx(auVar142,auVar129);
      auVar192 = vsubps_avx(auVar169,auVar23);
      auVar46._4_4_ = auVar162._4_4_ * auVar111._4_4_;
      auVar46._0_4_ = auVar162._0_4_ * auVar111._0_4_;
      auVar46._8_4_ = auVar162._8_4_ * auVar111._8_4_;
      auVar46._12_4_ = auVar162._12_4_ * auVar111._12_4_;
      auVar46._16_4_ = auVar162._16_4_ * auVar111._16_4_;
      auVar46._20_4_ = auVar162._20_4_ * auVar111._20_4_;
      auVar46._24_4_ = auVar162._24_4_ * auVar111._24_4_;
      auVar46._28_4_ = auVar121._28_4_;
      auVar15 = vfmsub231ps_fma(auVar46,auVar169,auVar113);
      auVar47._4_4_ = auVar142._4_4_ * auVar113._4_4_;
      auVar47._0_4_ = auVar142._0_4_ * auVar113._0_4_;
      auVar47._8_4_ = auVar142._8_4_ * auVar113._8_4_;
      auVar47._12_4_ = auVar142._12_4_ * auVar113._12_4_;
      auVar47._16_4_ = auVar142._16_4_ * auVar113._16_4_;
      auVar47._20_4_ = auVar142._20_4_ * auVar113._20_4_;
      auVar47._24_4_ = auVar142._24_4_ * auVar113._24_4_;
      auVar47._28_4_ = auVar165._28_4_;
      auVar108 = vfmsub231ps_fma(auVar47,auVar111,auVar124);
      auVar159 = ZEXT864(0) << 0x20;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar116._0_4_ = auVar124._0_4_ * auVar169._0_4_;
      auVar116._4_4_ = auVar124._4_4_ * auVar169._4_4_;
      auVar116._8_4_ = auVar124._8_4_ * auVar169._8_4_;
      auVar116._12_4_ = auVar124._12_4_ * auVar169._12_4_;
      auVar116._16_4_ = auVar124._16_4_ * auVar169._16_4_;
      auVar116._20_4_ = auVar124._20_4_ * auVar169._20_4_;
      auVar116._24_4_ = auVar124._24_4_ * auVar169._24_4_;
      auVar116._28_4_ = 0;
      auVar108 = vfmsub231ps_fma(auVar116,auVar142,auVar162);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar108));
      auVar117._0_4_ = auVar192._0_4_ * auVar119._0_4_;
      auVar117._4_4_ = auVar192._4_4_ * auVar119._4_4_;
      auVar117._8_4_ = auVar192._8_4_ * auVar119._8_4_;
      auVar117._12_4_ = auVar192._12_4_ * auVar119._12_4_;
      auVar117._16_4_ = auVar192._16_4_ * auVar119._16_4_;
      auVar117._20_4_ = auVar192._20_4_ * auVar119._20_4_;
      auVar117._24_4_ = auVar192._24_4_ * auVar119._24_4_;
      auVar117._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar117,auVar189,auVar23);
      auVar48._4_4_ = auVar183._4_4_ * auVar23._4_4_;
      auVar48._0_4_ = auVar183._0_4_ * auVar23._0_4_;
      auVar48._8_4_ = auVar183._8_4_ * auVar23._8_4_;
      auVar48._12_4_ = auVar183._12_4_ * auVar23._12_4_;
      auVar48._16_4_ = auVar183._16_4_ * auVar23._16_4_;
      auVar48._20_4_ = auVar183._20_4_ * auVar23._20_4_;
      auVar48._24_4_ = auVar183._24_4_ * auVar23._24_4_;
      auVar48._28_4_ = auVar23._28_4_;
      auVar161 = vfmsub231ps_fma(auVar48,auVar129,auVar192);
      auVar49._4_4_ = auVar189._4_4_ * auVar129._4_4_;
      auVar49._0_4_ = auVar189._0_4_ * auVar129._0_4_;
      auVar49._8_4_ = auVar189._8_4_ * auVar129._8_4_;
      auVar49._12_4_ = auVar189._12_4_ * auVar129._12_4_;
      auVar49._16_4_ = auVar189._16_4_ * auVar129._16_4_;
      auVar49._20_4_ = auVar189._20_4_ * auVar129._20_4_;
      auVar49._24_4_ = auVar189._24_4_ * auVar129._24_4_;
      auVar49._28_4_ = auVar24._28_4_;
      auVar147 = vfmsub231ps_fma(auVar49,auVar183,auVar119);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar161 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar161));
      auVar119 = vmaxps_avx(ZEXT1632(auVar108),ZEXT1632(auVar161));
      auVar119 = vcmpps_avx(auVar119,ZEXT832(0) << 0x20,2);
      auVar15 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
      auVar149 = vpand_avx(auVar15,auVar149);
      auVar119 = vpmovsxwd_avx2(auVar149);
      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar119 >> 0x7f,0) == '\0') &&
            (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar119 >> 0xbf,0) == '\0') &&
          (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar119[0x1f]) {
LAB_0139dff9:
        auVar157._8_8_ = uStack_5b8;
        auVar157._0_8_ = local_5c0;
        auVar157._16_8_ = uStack_5b0;
        auVar157._24_8_ = uStack_5a8;
      }
      else {
        auVar50._4_4_ = auVar124._4_4_ * auVar192._4_4_;
        auVar50._0_4_ = auVar124._0_4_ * auVar192._0_4_;
        auVar50._8_4_ = auVar124._8_4_ * auVar192._8_4_;
        auVar50._12_4_ = auVar124._12_4_ * auVar192._12_4_;
        auVar50._16_4_ = auVar124._16_4_ * auVar192._16_4_;
        auVar50._20_4_ = auVar124._20_4_ * auVar192._20_4_;
        auVar50._24_4_ = auVar124._24_4_ * auVar192._24_4_;
        auVar50._28_4_ = auVar119._28_4_;
        auVar177 = vfmsub231ps_fma(auVar50,auVar183,auVar162);
        auVar127._0_4_ = auVar162._0_4_ * auVar189._0_4_;
        auVar127._4_4_ = auVar162._4_4_ * auVar189._4_4_;
        auVar127._8_4_ = auVar162._8_4_ * auVar189._8_4_;
        auVar127._12_4_ = auVar162._12_4_ * auVar189._12_4_;
        auVar127._16_4_ = auVar162._16_4_ * auVar189._16_4_;
        auVar127._20_4_ = auVar162._20_4_ * auVar189._20_4_;
        auVar127._24_4_ = auVar162._24_4_ * auVar189._24_4_;
        auVar127._28_4_ = 0;
        auVar176 = vfmsub231ps_fma(auVar127,auVar113,auVar192);
        auVar51._4_4_ = auVar183._4_4_ * auVar113._4_4_;
        auVar51._0_4_ = auVar183._0_4_ * auVar113._0_4_;
        auVar51._8_4_ = auVar183._8_4_ * auVar113._8_4_;
        auVar51._12_4_ = auVar183._12_4_ * auVar113._12_4_;
        auVar51._16_4_ = auVar183._16_4_ * auVar113._16_4_;
        auVar51._20_4_ = auVar183._20_4_ * auVar113._20_4_;
        auVar51._24_4_ = auVar183._24_4_ * auVar113._24_4_;
        auVar51._28_4_ = auVar129._28_4_;
        auVar187 = vfmsub231ps_fma(auVar51,auVar189,auVar124);
        auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar176),ZEXT1632(auVar187));
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar177),_DAT_01f7b000);
        auVar119 = vrcpps_avx(ZEXT1632(auVar147));
        auVar200._8_4_ = 0x3f800000;
        auVar200._0_8_ = 0x3f8000003f800000;
        auVar200._12_4_ = 0x3f800000;
        auVar200._16_4_ = 0x3f800000;
        auVar200._20_4_ = 0x3f800000;
        auVar200._24_4_ = 0x3f800000;
        auVar200._28_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar119,ZEXT1632(auVar147),auVar200);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar119,auVar119);
        auVar181._0_4_ = auVar187._0_4_ * auVar169._0_4_;
        auVar181._4_4_ = auVar187._4_4_ * auVar169._4_4_;
        auVar181._8_4_ = auVar187._8_4_ * auVar169._8_4_;
        auVar181._12_4_ = auVar187._12_4_ * auVar169._12_4_;
        auVar181._16_4_ = auVar169._16_4_ * 0.0;
        auVar181._20_4_ = auVar169._20_4_ * 0.0;
        auVar181._24_4_ = auVar169._24_4_ * 0.0;
        auVar181._28_4_ = 0;
        auVar176 = vfmadd231ps_fma(auVar181,auVar142,ZEXT1632(auVar176));
        auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),ZEXT1632(auVar177),auVar111);
        fVar132 = auVar15._0_4_;
        fVar170 = auVar15._4_4_;
        fVar171 = auVar15._8_4_;
        fVar172 = auVar15._12_4_;
        auVar169 = ZEXT1632(CONCAT412(fVar172 * auVar176._12_4_,
                                      CONCAT48(fVar171 * auVar176._8_4_,
                                               CONCAT44(fVar170 * auVar176._4_4_,
                                                        fVar132 * auVar176._0_4_))));
        auVar118._4_4_ = uVar8;
        auVar118._0_4_ = uVar8;
        auVar118._8_4_ = uVar8;
        auVar118._12_4_ = uVar8;
        auVar118._16_4_ = uVar8;
        auVar118._20_4_ = uVar8;
        auVar118._24_4_ = uVar8;
        auVar118._28_4_ = uVar8;
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar128._4_4_ = uVar104;
        auVar128._0_4_ = uVar104;
        auVar128._8_4_ = uVar104;
        auVar128._12_4_ = uVar104;
        auVar128._16_4_ = uVar104;
        auVar128._20_4_ = uVar104;
        auVar128._24_4_ = uVar104;
        auVar128._28_4_ = uVar104;
        auVar111 = vcmpps_avx(auVar118,auVar169,2);
        auVar142 = vcmpps_avx(auVar169,auVar128,2);
        auVar111 = vandps_avx(auVar142,auVar111);
        auVar15 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar149 = vpand_avx(auVar149,auVar15);
        auVar111 = vpmovsxwd_avx2(auVar149);
        auVar159 = ZEXT864(0) << 0x20;
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0x7f,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar111 >> 0xbf,0) == '\0') &&
            (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar111[0x1f]) goto LAB_0139dff9;
        auVar111 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar147),4);
        auVar15 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar149 = vpand_avx(auVar149,auVar15);
        auVar111 = vpmovsxwd_avx2(auVar149);
        auVar157._8_8_ = uStack_5b8;
        auVar157._0_8_ = local_5c0;
        auVar157._16_8_ = uStack_5b0;
        auVar157._24_8_ = uStack_5a8;
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0x7f,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0xbf,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar111[0x1f] < '\0') {
          auVar119 = ZEXT1632(CONCAT412(fVar172 * auVar108._12_4_,
                                        CONCAT48(fVar171 * auVar108._8_4_,
                                                 CONCAT44(fVar170 * auVar108._4_4_,
                                                          fVar132 * auVar108._0_4_))));
          auVar129 = ZEXT1632(CONCAT412(fVar172 * auVar161._12_4_,
                                        CONCAT48(fVar171 * auVar161._8_4_,
                                                 CONCAT44(fVar170 * auVar161._4_4_,
                                                          fVar132 * auVar161._0_4_))));
          auVar156._8_4_ = 0x3f800000;
          auVar156._0_8_ = 0x3f8000003f800000;
          auVar156._12_4_ = 0x3f800000;
          auVar156._16_4_ = 0x3f800000;
          auVar156._20_4_ = 0x3f800000;
          auVar156._24_4_ = 0x3f800000;
          auVar156._28_4_ = 0x3f800000;
          auVar142 = vsubps_avx(auVar156,auVar119);
          _local_3e0 = vblendvps_avx(auVar142,auVar119,auVar22);
          auVar142 = vsubps_avx(auVar156,auVar129);
          local_4c0 = vblendvps_avx(auVar142,auVar129,auVar22);
          auVar157 = auVar111;
          local_400 = auVar169;
        }
      }
      auVar209 = ZEXT3264(_local_6a0);
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar157 >> 0x7f,0) == '\0') &&
            (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar157 >> 0xbf,0) == '\0') &&
          (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar157[0x1f]) {
        uVar102 = 0;
        auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,CONCAT416(fVar204,
                                                  CONCAT412(fVar204,CONCAT48(fVar204,CONCAT44(
                                                  fVar204,fVar204))))))));
        auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(fVar222,
                                                  CONCAT412(fVar225,CONCAT48(fVar222,uVar107)))))));
      }
      else {
        auVar111 = vsubps_avx(auVar190,auVar180);
        auVar149 = vfmadd213ps_fma(auVar111,_local_3e0,auVar180);
        fVar132 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar52._4_4_ = (auVar149._4_4_ + auVar149._4_4_) * fVar132;
        auVar52._0_4_ = (auVar149._0_4_ + auVar149._0_4_) * fVar132;
        auVar52._8_4_ = (auVar149._8_4_ + auVar149._8_4_) * fVar132;
        auVar52._12_4_ = (auVar149._12_4_ + auVar149._12_4_) * fVar132;
        auVar52._16_4_ = fVar132 * 0.0;
        auVar52._20_4_ = fVar132 * 0.0;
        auVar52._24_4_ = fVar132 * 0.0;
        auVar52._28_4_ = 0;
        auVar111 = vcmpps_avx(local_400,auVar52,6);
        auVar142 = auVar157 & auVar111;
        auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,CONCAT416(fVar204,
                                                  CONCAT412(fVar204,CONCAT48(fVar204,CONCAT44(
                                                  fVar204,fVar204))))))));
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0x7f,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar142 >> 0xbf,0) == '\0') &&
            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar142[0x1f]) {
          uVar102 = 0;
          auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar107
                                                                                    )))))));
        }
        else {
          auVar130._8_4_ = 0xbf800000;
          auVar130._0_8_ = 0xbf800000bf800000;
          auVar130._12_4_ = 0xbf800000;
          auVar130._16_4_ = 0xbf800000;
          auVar130._20_4_ = 0xbf800000;
          auVar130._24_4_ = 0xbf800000;
          auVar130._28_4_ = 0xbf800000;
          auVar141._8_4_ = 0x40000000;
          auVar141._0_8_ = 0x4000000040000000;
          auVar141._12_4_ = 0x40000000;
          auVar141._16_4_ = 0x40000000;
          auVar141._20_4_ = 0x40000000;
          auVar141._24_4_ = 0x40000000;
          auVar141._28_4_ = 0x40000000;
          auVar149 = vfmadd213ps_fma(local_4c0,auVar141,auVar130);
          local_3a0 = _local_3e0;
          local_380 = ZEXT1632(auVar149);
          local_360 = local_400;
          local_340 = 0;
          local_4c0 = local_380;
          if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar102 = 0;
            auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar107
                                                                                    )))))));
          }
          else {
            auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar107
                                                                                    )))))));
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar102 = CONCAT71((int7)(uVar102 >> 8),1),
               pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar111 = vandps_avx(auVar111,auVar157);
              fVar132 = 1.0 / auVar115._0_4_;
              local_2c0[0] = fVar132 * ((float)local_3e0._0_4_ + 0.0);
              local_2c0[1] = fVar132 * ((float)local_3e0._4_4_ + 1.0);
              local_2c0[2] = fVar132 * (fStack_3d8 + 2.0);
              local_2c0[3] = fVar132 * (fStack_3d4 + 3.0);
              fStack_2b0 = fVar132 * (fStack_3d0 + 4.0);
              fStack_2ac = fVar132 * (fStack_3cc + 5.0);
              fStack_2a8 = fVar132 * (fStack_3c8 + 6.0);
              fStack_2a4 = fStack_3c4 + 7.0;
              local_4c0._0_8_ = auVar149._0_8_;
              local_4c0._8_8_ = auVar149._8_8_;
              local_2a0 = local_4c0._0_8_;
              uStack_298 = local_4c0._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_400;
              uVar104 = vmovmskps_avx(auVar111);
              uVar98 = 0;
              uVar103 = CONCAT44((int)(uVar102 >> 0x20),uVar104);
              for (uVar102 = uVar103; (uVar102 & 1) == 0;
                  uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                uVar98 = uVar98 + 1;
              }
              local_660._4_4_ = uVar97;
              local_660._0_4_ = uVar97;
              local_660._8_4_ = uVar97;
              local_660._12_4_ = uVar97;
              local_660._16_4_ = uVar97;
              local_660._20_4_ = uVar97;
              local_660._24_4_ = uVar97;
              local_660._28_4_ = uVar97;
              local_720 = CONCAT44((uint)uStack_718,(uint)uStack_718);
              uStack_718._4_4_ = (uint)uStack_718;
              uStack_710._0_4_ = (uint)uStack_718;
              uStack_710._4_4_ = (uint)uStack_718;
              auVar95 = _local_720;
              uStack_708._0_4_ = (uint)uStack_718;
              uStack_708._4_4_ = (uint)uStack_718;
              auVar111 = _local_720;
              _local_5a0 = auVar21;
              local_33c = iVar96;
              local_330 = uVar160;
              uStack_328 = uVar86;
              local_320 = uVar87;
              uStack_318 = uVar88;
              local_310 = uVar89;
              uStack_308 = uVar90;
              while (uVar103 != 0) {
                uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                fVar132 = local_2c0[uVar98];
                auVar109._4_4_ = fVar132;
                auVar109._0_4_ = fVar132;
                auVar109._8_4_ = fVar132;
                auVar109._12_4_ = fVar132;
                local_200._16_4_ = fVar132;
                local_200._0_16_ = auVar109;
                local_200._20_4_ = fVar132;
                local_200._24_4_ = fVar132;
                local_200._28_4_ = fVar132;
                local_1e0 = *(undefined4 *)((long)&local_2a0 + uVar98 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_280 + uVar98 * 4);
                fVar171 = 1.0 - fVar132;
                auVar149 = ZEXT416((uint)(fVar132 * fVar171 * 4.0));
                auVar15 = vfnmsub213ss_fma(auVar109,auVar109,auVar149);
                auVar149 = vfmadd213ss_fma(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),auVar149);
                fVar170 = auVar149._0_4_ * 0.5;
                fVar132 = fVar132 * fVar132 * 0.5;
                auVar150._0_4_ = fVar132 * local_6b0;
                auVar150._4_4_ = fVar132 * fStack_6ac;
                auVar150._8_4_ = fVar132 * fStack_6a8;
                auVar150._12_4_ = fVar132 * fStack_6a4;
                auVar134._4_4_ = fVar170;
                auVar134._0_4_ = fVar170;
                auVar134._8_4_ = fVar170;
                auVar134._12_4_ = fVar170;
                auVar149 = vfmadd132ps_fma(auVar134,auVar150,auVar152);
                fVar132 = auVar15._0_4_ * 0.5;
                auVar151._4_4_ = fVar132;
                auVar151._0_4_ = fVar132;
                auVar151._8_4_ = fVar132;
                auVar151._12_4_ = fVar132;
                auVar149 = vfmadd132ps_fma(auVar151,auVar149,auVar20);
                local_6e0.context = context->user;
                fVar132 = fVar171 * -fVar171 * 0.5;
                auVar135._4_4_ = fVar132;
                auVar135._0_4_ = fVar132;
                auVar135._8_4_ = fVar132;
                auVar135._12_4_ = fVar132;
                auVar15 = vfmadd132ps_fma(auVar135,auVar149,auVar11);
                local_260 = auVar15._0_4_;
                uStack_25c = local_260;
                uStack_258 = local_260;
                uStack_254 = local_260;
                uStack_250 = local_260;
                uStack_24c = local_260;
                uStack_248 = local_260;
                uStack_244 = local_260;
                auVar149 = vmovshdup_avx(auVar15);
                local_240 = auVar149._0_8_;
                uStack_238 = local_240;
                uStack_230 = local_240;
                uStack_228 = local_240;
                auVar149 = vshufps_avx(auVar15,auVar15,0xaa);
                local_220._0_8_ = auVar149._0_8_;
                local_220._8_8_ = local_220._0_8_;
                local_220._16_8_ = local_220._0_8_;
                local_220._24_8_ = local_220._0_8_;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                uStack_710 = auVar95._16_8_;
                uStack_708 = auVar111._24_8_;
                local_1c0 = local_720;
                uStack_1b8 = uStack_718;
                uStack_1b0 = uStack_710;
                uStack_1a8 = uStack_708;
                local_1a0 = local_660._0_8_;
                uStack_198 = local_660._8_8_;
                uStack_190 = local_660._16_8_;
                uStack_188 = local_660._24_8_;
                auVar142 = vpcmpeqd_avx2(local_220,local_220);
                local_180 = (local_6e0.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_6e0.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_600 = local_440;
                local_6e0.valid = (int *)local_600;
                local_6e0.geometryUserPtr = pGVar18->userPtr;
                local_6e0.hit = (RTCHitN *)&local_260;
                local_6e0.N = 8;
                local_6e0.ray = (RTCRayN *)ray;
                if (pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar142 = ZEXT1632(auVar142._0_16_);
                  (*pGVar18->occlusionFilterN)(&local_6e0);
                  auVar209 = ZEXT3264(_local_6a0);
                  auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,
                                                  CONCAT416(fVar204,CONCAT412(fVar204,CONCAT48(
                                                  fVar204,CONCAT44(fVar204,fVar204))))))));
                  auVar142 = vpcmpeqd_avx2(auVar142,auVar142);
                  auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar119 = vpcmpeqd_avx2(auVar159._0_32_,local_600);
                auVar169 = auVar142 & ~auVar119;
                if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar169 >> 0x7f,0) == '\0') &&
                      (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar169 >> 0xbf,0) == '\0') &&
                    (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar169[0x1f]) {
                  auVar119 = auVar119 ^ auVar142;
                  auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar107)))))));
                }
                else {
                  p_Var19 = context->args->filter;
                  if (p_Var19 == (RTCFilterFunctionN)0x0) {
                    auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar107)))))));
                  }
                  else {
                    auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar107)))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar18->field_8).field_0x2 & 0x40) != 0)) {
                      auVar142 = ZEXT1632(auVar142._0_16_);
                      (*p_Var19)(&local_6e0);
                      auVar209 = ZEXT3264(_local_6a0);
                      auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar107)))))));
                      auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,
                                                  CONCAT416(fVar204,CONCAT412(fVar204,CONCAT48(
                                                  fVar204,CONCAT44(fVar204,fVar204))))))));
                      auVar142 = vpcmpeqd_avx2(auVar142,auVar142);
                      auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                  }
                  auVar169 = vpcmpeqd_avx2(auVar159._0_32_,local_600);
                  auVar119 = auVar169 ^ auVar142;
                  auVar143._8_4_ = 0xff800000;
                  auVar143._0_8_ = 0xff800000ff800000;
                  auVar143._12_4_ = 0xff800000;
                  auVar143._16_4_ = 0xff800000;
                  auVar143._20_4_ = 0xff800000;
                  auVar143._24_4_ = 0xff800000;
                  auVar143._28_4_ = 0xff800000;
                  auVar142 = vblendvps_avx(auVar143,*(undefined1 (*) [32])(local_6e0.ray + 0x100),
                                           auVar169);
                  *(undefined1 (*) [32])(local_6e0.ray + 0x100) = auVar142;
                }
                if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar119 >> 0x7f,0) != '\0') ||
                      (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar119 >> 0xbf,0) != '\0') ||
                    (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar119[0x1f] < '\0') {
                  uVar102 = 1;
                  goto LAB_0139d1fd;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar104;
                uVar102 = uVar98 & 0x3f;
                uVar98 = 0;
                uVar103 = uVar103 ^ 1L << uVar102;
                for (uVar102 = uVar103; (uVar102 & 1) == 0;
                    uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                  uVar98 = uVar98 + 1;
                }
              }
              uVar102 = 0;
            }
          }
LAB_0139d1fd:
        }
      }
    }
    auVar203 = ZEXT3264(auVar203._0_32_);
    auVar159 = ZEXT3264(local_680);
    auVar146 = ZEXT464((uint)fVar133);
    if (8 < iVar96) {
      local_480._4_4_ = iVar96;
      local_480._0_4_ = iVar96;
      local_480._8_4_ = iVar96;
      local_480._12_4_ = iVar96;
      local_480._16_4_ = iVar96;
      local_480._20_4_ = iVar96;
      local_480._24_4_ = iVar96;
      local_480._28_4_ = iVar96;
      local_4a0._4_4_ = fVar133;
      local_4a0._0_4_ = fVar133;
      fStack_498 = fVar133;
      fStack_494 = fVar133;
      fStack_490 = fVar133;
      fStack_48c = fVar133;
      fStack_488 = fVar133;
      fStack_484 = fVar133;
      local_120 = local_640._0_4_;
      uStack_11c = local_640._0_4_;
      uStack_118 = local_640._0_4_;
      uStack_114 = local_640._0_4_;
      uStack_110 = local_640._0_4_;
      uStack_10c = local_640._0_4_;
      uStack_108 = local_640._0_4_;
      uStack_104 = local_640._0_4_;
      local_140 = 1.0 / (float)local_500._0_4_;
      fStack_13c = local_140;
      fStack_138 = local_140;
      fStack_134 = local_140;
      fStack_130 = local_140;
      fStack_12c = local_140;
      fStack_128 = local_140;
      fStack_124 = local_140;
      local_500._4_4_ = uVar97;
      local_500._0_4_ = uVar97;
      uStack_4f8._0_4_ = uVar97;
      uStack_4f8._4_4_ = uVar97;
      local_520._4_4_ = local_520._0_4_;
      local_520._8_4_ = local_520._0_4_;
      local_520._12_4_ = local_520._0_4_;
      uStack_510 = local_520._0_4_;
      uStack_50c = local_520._0_4_;
      uStack_508 = local_520._0_4_;
      uStack_504 = local_520._0_4_;
      _local_6a0 = auVar209._0_32_;
      uStack_4f0 = uVar97;
      uStack_4ec = uVar97;
      uStack_4e8 = uVar97;
      uStack_4e4 = uVar97;
      for (lVar101 = 8; lVar101 < iVar96; lVar101 = lVar101 + 8) {
        auVar124 = auVar203._0_32_;
        auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 * 4 + lVar105);
        auVar142 = *(undefined1 (*) [32])(lVar105 + 0x21fffac + lVar101 * 4);
        auVar169 = *(undefined1 (*) [32])(lVar105 + 0x2200430 + lVar101 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar105 + 0x22008b4 + lVar101 * 4);
        fVar175 = *(float *)*pauVar5;
        fVar205 = *(float *)(*pauVar5 + 4);
        fVar210 = *(float *)(*pauVar5 + 8);
        fVar81 = *(float *)(*pauVar5 + 0xc);
        fVar82 = *(float *)(*pauVar5 + 0x10);
        fVar83 = *(float *)(*pauVar5 + 0x14);
        fVar84 = *(float *)(*pauVar5 + 0x18);
        auVar93 = *(undefined1 (*) [28])*pauVar5;
        auVar197._0_4_ = fVar175 * auVar191._0_4_;
        auVar197._4_4_ = fVar205 * auVar191._4_4_;
        auVar197._8_4_ = fVar210 * auVar191._8_4_;
        auVar197._12_4_ = fVar81 * auVar191._12_4_;
        auVar197._16_4_ = fVar82 * auVar191._16_4_;
        auVar197._20_4_ = fVar83 * auVar191._20_4_;
        auVar197._28_36_ = auVar209._28_36_;
        auVar197._24_4_ = fVar84 * auVar191._24_4_;
        auVar209._0_4_ = fVar175 * auVar186._0_4_;
        auVar209._4_4_ = fVar205 * auVar186._4_4_;
        auVar209._8_4_ = fVar210 * auVar186._8_4_;
        auVar209._12_4_ = fVar81 * auVar186._12_4_;
        auVar209._16_4_ = fVar82 * auVar186._16_4_;
        auVar209._20_4_ = fVar83 * auVar186._20_4_;
        auVar209._28_36_ = auVar146._28_36_;
        auVar209._24_4_ = fVar84 * auVar186._24_4_;
        auVar152 = vfmadd231ps_fma(auVar197._0_32_,auVar169,auVar139);
        auVar20 = vfmadd231ps_fma(auVar209._0_32_,auVar169,auVar163);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar142,auVar214);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar142,local_540);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar111,auVar155);
        auVar209 = ZEXT1664(auVar152);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar111,local_620);
        auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 * 4 + lVar105);
        auVar129 = *(undefined1 (*) [32])(lVar105 + 0x22023cc + lVar101 * 4);
        auVar23 = *(undefined1 (*) [32])(lVar105 + 0x2202850 + lVar101 * 4);
        pauVar6 = (undefined1 (*) [28])(lVar105 + 0x2202cd4 + lVar101 * 4);
        auVar92 = *pauVar6;
        auVar146._0_4_ = auVar191._0_4_ * *(float *)*pauVar6;
        auVar146._4_4_ = auVar191._4_4_ * *(float *)(*pauVar6 + 4);
        auVar146._8_4_ = auVar191._8_4_ * *(float *)(*pauVar6 + 8);
        auVar146._12_4_ = auVar191._12_4_ * *(float *)(*pauVar6 + 0xc);
        auVar146._16_4_ = auVar191._16_4_ * *(float *)(*pauVar6 + 0x10);
        auVar146._20_4_ = auVar191._20_4_ * *(float *)(*pauVar6 + 0x14);
        auVar146._28_36_ = auVar191._28_36_;
        auVar146._24_4_ = auVar191._24_4_ * *(float *)(*pauVar6 + 0x18);
        auVar191._0_4_ = auVar186._0_4_ * *(float *)*pauVar6;
        auVar191._4_4_ = auVar186._4_4_ * *(float *)(*pauVar6 + 4);
        auVar191._8_4_ = auVar186._8_4_ * *(float *)(*pauVar6 + 8);
        auVar191._12_4_ = auVar186._12_4_ * *(float *)(*pauVar6 + 0xc);
        auVar191._16_4_ = auVar186._16_4_ * *(float *)(*pauVar6 + 0x10);
        auVar191._20_4_ = auVar186._20_4_ * *(float *)(*pauVar6 + 0x14);
        auVar191._28_36_ = auVar186._28_36_;
        auVar191._24_4_ = auVar186._24_4_ * *(float *)(*pauVar6 + 0x18);
        auVar11 = vfmadd231ps_fma(auVar146._0_32_,auVar23,auVar139);
        auVar149 = vfmadd231ps_fma(auVar191._0_32_,auVar23,auVar163);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,auVar214);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar129,local_540);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar119,auVar155);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar119,local_620);
        local_660 = ZEXT1632(auVar152);
        auVar24 = vsubps_avx(ZEXT1632(auVar11),local_660);
        auVar113 = ZEXT1632(auVar149);
        local_640 = ZEXT1632(auVar20);
        auVar121 = vsubps_avx(auVar113,local_640);
        auVar53._4_4_ = auVar24._4_4_ * auVar20._4_4_;
        auVar53._0_4_ = auVar24._0_4_ * auVar20._0_4_;
        auVar53._8_4_ = auVar24._8_4_ * auVar20._8_4_;
        auVar53._12_4_ = auVar24._12_4_ * auVar20._12_4_;
        auVar53._16_4_ = auVar24._16_4_ * 0.0;
        auVar53._20_4_ = auVar24._20_4_ * 0.0;
        auVar53._24_4_ = auVar24._24_4_ * 0.0;
        auVar53._28_4_ = *(undefined4 *)pauVar6[1];
        fVar133 = auVar121._0_4_;
        fVar132 = auVar121._4_4_;
        auVar94._4_4_ = auVar152._4_4_ * fVar132;
        auVar94._0_4_ = auVar152._0_4_ * fVar133;
        fVar170 = auVar121._8_4_;
        auVar94._8_4_ = auVar152._8_4_ * fVar170;
        fVar171 = auVar121._12_4_;
        auVar94._12_4_ = auVar152._12_4_ * fVar171;
        fVar172 = auVar121._16_4_;
        auVar94._16_4_ = fVar172 * 0.0;
        fVar173 = auVar121._20_4_;
        auVar94._20_4_ = fVar173 * 0.0;
        fVar174 = auVar121._24_4_;
        auVar94._24_4_ = fVar174 * 0.0;
        auVar94._28_4_ = uVar201;
        auVar21 = vsubps_avx(auVar53,auVar94);
        auVar182._0_4_ = fVar175 * (float)local_100;
        auVar182._4_4_ = fVar205 * local_100._4_4_;
        auVar182._8_4_ = fVar210 * (float)uStack_f8;
        auVar182._12_4_ = fVar81 * uStack_f8._4_4_;
        auVar182._16_4_ = fVar82 * (float)uStack_f0;
        auVar182._20_4_ = fVar83 * uStack_f0._4_4_;
        auVar182._24_4_ = fVar84 * (float)uStack_e8;
        auVar182._28_4_ = 0;
        auVar152 = vfmadd231ps_fma(auVar182,auVar169,local_e0);
        auVar146 = ZEXT3264(local_c0);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),local_c0,auVar142);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),local_a0,auVar111);
        local_900 = auVar92._0_4_;
        fStack_8fc = auVar92._4_4_;
        fStack_8f8 = auVar92._8_4_;
        fStack_8f4 = auVar92._12_4_;
        fStack_8f0 = auVar92._16_4_;
        fStack_8ec = auVar92._20_4_;
        fStack_8e8 = auVar92._24_4_;
        auVar54._4_4_ = fStack_8fc * local_100._4_4_;
        auVar54._0_4_ = local_900 * (float)local_100;
        auVar54._8_4_ = fStack_8f8 * (float)uStack_f8;
        auVar54._12_4_ = fStack_8f4 * uStack_f8._4_4_;
        auVar54._16_4_ = fStack_8f0 * (float)uStack_f0;
        auVar54._20_4_ = fStack_8ec * uStack_f0._4_4_;
        auVar54._24_4_ = fStack_8e8 * (float)uStack_e8;
        auVar54._28_4_ = uStack_e8._4_4_;
        auVar149 = vfmadd231ps_fma(auVar54,auVar23,local_e0);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar129,local_c0);
        auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar119,local_a0);
        auVar80._4_4_ = fVar132 * fVar132;
        auVar80._0_4_ = fVar133 * fVar133;
        auVar80._8_4_ = fVar170 * fVar170;
        auVar80._12_4_ = fVar171 * fVar171;
        auVar80._16_4_ = fVar172 * fVar172;
        auVar80._20_4_ = fVar173 * fVar173;
        auVar80._24_4_ = fVar174 * fVar174;
        auVar80._28_4_ = local_540._28_4_;
        auVar15 = vfmadd231ps_fma(auVar80,auVar24,auVar24);
        _local_5a0 = ZEXT1632(auVar149);
        auVar165 = vmaxps_avx(ZEXT1632(auVar152),_local_5a0);
        auVar195._0_4_ = auVar165._0_4_ * auVar165._0_4_ * auVar15._0_4_;
        auVar195._4_4_ = auVar165._4_4_ * auVar165._4_4_ * auVar15._4_4_;
        auVar195._8_4_ = auVar165._8_4_ * auVar165._8_4_ * auVar15._8_4_;
        auVar195._12_4_ = auVar165._12_4_ * auVar165._12_4_ * auVar15._12_4_;
        auVar195._16_4_ = auVar165._16_4_ * auVar165._16_4_ * 0.0;
        auVar195._20_4_ = auVar165._20_4_ * auVar165._20_4_ * 0.0;
        auVar195._24_4_ = auVar165._24_4_ * auVar165._24_4_ * 0.0;
        auVar195._28_4_ = 0;
        auVar55._4_4_ = auVar21._4_4_ * auVar21._4_4_;
        auVar55._0_4_ = auVar21._0_4_ * auVar21._0_4_;
        auVar55._8_4_ = auVar21._8_4_ * auVar21._8_4_;
        auVar55._12_4_ = auVar21._12_4_ * auVar21._12_4_;
        auVar55._16_4_ = auVar21._16_4_ * auVar21._16_4_;
        auVar55._20_4_ = auVar21._20_4_ * auVar21._20_4_;
        auVar55._24_4_ = auVar21._24_4_ * auVar21._24_4_;
        auVar55._28_4_ = auVar21._28_4_;
        auVar165 = vcmpps_avx(auVar55,auVar195,2);
        local_340 = (int)lVar101;
        auVar196._4_4_ = local_340;
        auVar196._0_4_ = local_340;
        auVar196._8_4_ = local_340;
        auVar196._12_4_ = local_340;
        auVar196._16_4_ = local_340;
        auVar196._20_4_ = local_340;
        auVar196._24_4_ = local_340;
        auVar196._28_4_ = local_340;
        auVar21 = vpor_avx2(auVar196,_DAT_01fb4ba0);
        auVar22 = vpcmpgtd_avx2(local_480,auVar21);
        auVar21 = auVar22 & auVar165;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0x7f,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0xbf,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar21[0x1f]) {
          auVar203 = ZEXT3264(auVar124);
          auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,CONCAT416(
                                                  fVar204,CONCAT412(fVar204,CONCAT48(fVar204,
                                                  CONCAT44(fVar204,fVar204))))))));
          auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar107
                                                                                    )))))));
        }
        else {
          _local_560 = vandps_avx(auVar22,auVar165);
          auVar56._4_4_ = (float)local_6a0._4_4_ * fStack_8fc;
          auVar56._0_4_ = (float)local_6a0._0_4_ * local_900;
          auVar56._8_4_ = fStack_698 * fStack_8f8;
          auVar56._12_4_ = fStack_694 * fStack_8f4;
          auVar56._16_4_ = fStack_690 * fStack_8f0;
          auVar56._20_4_ = fStack_68c * fStack_8ec;
          auVar56._24_4_ = fStack_688 * fStack_8e8;
          auVar56._28_4_ = auVar165._28_4_;
          auVar149 = vfmadd213ps_fma(auVar23,local_3c0,auVar56);
          auVar149 = vfmadd213ps_fma(auVar129,auVar212,ZEXT1632(auVar149));
          auVar149 = vfmadd132ps_fma(auVar119,ZEXT1632(auVar149),local_580);
          local_460._0_4_ = auVar93._0_4_;
          local_460._4_4_ = auVar93._4_4_;
          fStack_458 = auVar93._8_4_;
          fStack_454 = auVar93._12_4_;
          fStack_450 = auVar93._16_4_;
          fStack_44c = auVar93._20_4_;
          fStack_448 = auVar93._24_4_;
          auVar57._4_4_ = (float)local_6a0._4_4_ * (float)local_460._4_4_;
          auVar57._0_4_ = (float)local_6a0._0_4_ * (float)local_460._0_4_;
          auVar57._8_4_ = fStack_698 * fStack_458;
          auVar57._12_4_ = fStack_694 * fStack_454;
          auVar57._16_4_ = fStack_690 * fStack_450;
          auVar57._20_4_ = fStack_68c * fStack_44c;
          auVar57._24_4_ = fStack_688 * fStack_448;
          auVar57._28_4_ = auVar165._28_4_;
          auVar15 = vfmadd213ps_fma(auVar169,local_3c0,auVar57);
          auVar15 = vfmadd213ps_fma(auVar142,auVar212,ZEXT1632(auVar15));
          auVar142 = *(undefined1 (*) [32])(lVar105 + 0x2200d38 + lVar101 * 4);
          auVar169 = *(undefined1 (*) [32])(lVar105 + 0x22011bc + lVar101 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar105 + 0x2201640 + lVar101 * 4);
          pfVar7 = (float *)(lVar105 + 0x2201ac4 + lVar101 * 4);
          fVar133 = *pfVar7;
          fVar132 = pfVar7[1];
          fVar170 = pfVar7[2];
          fVar171 = pfVar7[3];
          fVar172 = pfVar7[4];
          fVar173 = pfVar7[5];
          fVar174 = pfVar7[6];
          auVar58._4_4_ = fVar132 * fVar204;
          auVar58._0_4_ = fVar133 * fVar204;
          auVar58._8_4_ = fVar170 * fVar204;
          auVar58._12_4_ = fVar171 * fVar204;
          auVar58._16_4_ = fVar172 * fVar204;
          auVar58._20_4_ = fVar173 * fVar204;
          auVar58._24_4_ = fVar174 * fVar204;
          auVar58._28_4_ = auVar16._4_4_;
          auVar207._0_4_ = fVar133 * fVar222;
          auVar207._4_4_ = fVar132 * fVar225;
          auVar207._8_4_ = fVar170 * fVar222;
          auVar207._12_4_ = fVar171 * fVar225;
          auVar207._16_4_ = fVar172 * fVar222;
          auVar207._20_4_ = fVar173 * fVar225;
          auVar207._24_4_ = fVar174 * fVar222;
          auVar207._28_4_ = 0;
          auVar59._4_4_ = fVar132 * (float)local_6a0._4_4_;
          auVar59._0_4_ = fVar133 * (float)local_6a0._0_4_;
          auVar59._8_4_ = fVar170 * fStack_698;
          auVar59._12_4_ = fVar171 * fStack_694;
          auVar59._16_4_ = fVar172 * fStack_690;
          auVar59._20_4_ = fVar173 * fStack_68c;
          auVar59._24_4_ = fVar174 * fStack_688;
          auVar59._28_4_ = pfVar7[7];
          auVar108 = vfmadd231ps_fma(auVar58,auVar119,auVar139);
          auVar161 = vfmadd231ps_fma(auVar207,auVar119,auVar163);
          auVar147 = vfmadd231ps_fma(auVar59,local_3c0,auVar119);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar169,auVar214);
          auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar169,local_540);
          auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar169,auVar212);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar142,auVar155);
          auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar142,local_620);
          auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar142,local_580);
          pfVar7 = (float *)(lVar105 + 0x2203ee4 + lVar101 * 4);
          fVar133 = *pfVar7;
          fVar132 = pfVar7[1];
          fVar170 = pfVar7[2];
          fVar171 = pfVar7[3];
          fVar172 = pfVar7[4];
          fVar173 = pfVar7[5];
          fVar174 = pfVar7[6];
          auVar60._4_4_ = fVar204 * fVar132;
          auVar60._0_4_ = fVar204 * fVar133;
          auVar60._8_4_ = fVar204 * fVar170;
          auVar60._12_4_ = fVar204 * fVar171;
          auVar60._16_4_ = fVar204 * fVar172;
          auVar60._20_4_ = fVar204 * fVar173;
          auVar60._24_4_ = fVar204 * fVar174;
          auVar60._28_4_ = auVar24._28_4_;
          auVar61._4_4_ = fVar225 * fVar132;
          auVar61._0_4_ = fVar222 * fVar133;
          auVar61._8_4_ = fVar222 * fVar170;
          auVar61._12_4_ = fVar225 * fVar171;
          auVar61._16_4_ = fVar222 * fVar172;
          auVar61._20_4_ = fVar225 * fVar173;
          auVar61._24_4_ = fVar222 * fVar174;
          auVar61._28_4_ = auVar121._28_4_;
          auVar62._4_4_ = fVar132 * (float)local_6a0._4_4_;
          auVar62._0_4_ = fVar133 * (float)local_6a0._0_4_;
          auVar62._8_4_ = fVar170 * fStack_698;
          auVar62._12_4_ = fVar171 * fStack_694;
          auVar62._16_4_ = fVar172 * fStack_690;
          auVar62._20_4_ = fVar173 * fStack_68c;
          auVar62._24_4_ = fVar174 * fStack_688;
          auVar62._28_4_ = pfVar7[7];
          auVar142 = *(undefined1 (*) [32])(lVar105 + 0x2203a60 + lVar101 * 4);
          auVar176 = vfmadd231ps_fma(auVar60,auVar142,auVar139);
          auVar177 = vfmadd231ps_fma(auVar61,auVar142,auVar163);
          auVar187 = vfmadd231ps_fma(auVar62,local_3c0,auVar142);
          auVar142 = *(undefined1 (*) [32])(lVar105 + 0x22035dc + lVar101 * 4);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar142,auVar214);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar142,local_540);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar142,auVar212);
          auVar142 = *(undefined1 (*) [32])(lVar105 + 0x2203158 + lVar101 * 4);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar142,auVar155);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar142,local_620);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),local_580,auVar142);
          auVar142 = vandps_avx(ZEXT1632(auVar108),local_420);
          auVar169 = vandps_avx(ZEXT1632(auVar161),local_420);
          auVar169 = vmaxps_avx(auVar142,auVar169);
          auVar142 = vandps_avx(ZEXT1632(auVar147),local_420);
          auVar142 = vmaxps_avx(auVar169,auVar142);
          auVar142 = vcmpps_avx(auVar142,_local_4a0,1);
          auVar119 = vblendvps_avx(ZEXT1632(auVar108),auVar24,auVar142);
          auVar129 = vblendvps_avx(ZEXT1632(auVar161),auVar121,auVar142);
          auVar142 = vandps_avx(ZEXT1632(auVar176),local_420);
          auVar169 = vandps_avx(ZEXT1632(auVar177),local_420);
          auVar169 = vmaxps_avx(auVar142,auVar169);
          auVar142 = vandps_avx(local_420,ZEXT1632(auVar187));
          auVar142 = vmaxps_avx(auVar169,auVar142);
          auVar169 = vcmpps_avx(auVar142,_local_4a0,1);
          auVar142 = vblendvps_avx(ZEXT1632(auVar176),auVar24,auVar169);
          auVar169 = vblendvps_avx(ZEXT1632(auVar177),auVar121,auVar169);
          auVar15 = vfmadd213ps_fma(auVar111,local_580,ZEXT1632(auVar15));
          auVar108 = vfmadd213ps_fma(auVar119,auVar119,ZEXT832(0) << 0x20);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar129,auVar129);
          auVar111 = vrsqrtps_avx(ZEXT1632(auVar108));
          fVar133 = auVar111._0_4_;
          fVar132 = auVar111._4_4_;
          fVar170 = auVar111._8_4_;
          fVar171 = auVar111._12_4_;
          fVar172 = auVar111._16_4_;
          fVar173 = auVar111._20_4_;
          fVar174 = auVar111._24_4_;
          auVar63._4_4_ = fVar132 * fVar132 * fVar132 * auVar108._4_4_ * -0.5;
          auVar63._0_4_ = fVar133 * fVar133 * fVar133 * auVar108._0_4_ * -0.5;
          auVar63._8_4_ = fVar170 * fVar170 * fVar170 * auVar108._8_4_ * -0.5;
          auVar63._12_4_ = fVar171 * fVar171 * fVar171 * auVar108._12_4_ * -0.5;
          auVar63._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar63._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar63._24_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar63._28_4_ = 0;
          auVar158._8_4_ = 0x3fc00000;
          auVar158._0_8_ = 0x3fc000003fc00000;
          auVar158._12_4_ = 0x3fc00000;
          auVar158._16_4_ = 0x3fc00000;
          auVar158._20_4_ = 0x3fc00000;
          auVar158._24_4_ = 0x3fc00000;
          auVar158._28_4_ = 0x3fc00000;
          auVar108 = vfmadd231ps_fma(auVar63,auVar158,auVar111);
          fVar133 = auVar108._0_4_;
          fVar132 = auVar108._4_4_;
          auVar64._4_4_ = auVar129._4_4_ * fVar132;
          auVar64._0_4_ = auVar129._0_4_ * fVar133;
          fVar170 = auVar108._8_4_;
          auVar64._8_4_ = auVar129._8_4_ * fVar170;
          fVar171 = auVar108._12_4_;
          auVar64._12_4_ = auVar129._12_4_ * fVar171;
          auVar64._16_4_ = auVar129._16_4_ * 0.0;
          auVar64._20_4_ = auVar129._20_4_ * 0.0;
          auVar64._24_4_ = auVar129._24_4_ * 0.0;
          auVar64._28_4_ = auVar129._28_4_;
          auVar65._4_4_ = fVar132 * -auVar119._4_4_;
          auVar65._0_4_ = fVar133 * -auVar119._0_4_;
          auVar65._8_4_ = fVar170 * -auVar119._8_4_;
          auVar65._12_4_ = fVar171 * -auVar119._12_4_;
          auVar65._16_4_ = -auVar119._16_4_ * 0.0;
          auVar65._20_4_ = -auVar119._20_4_ * 0.0;
          auVar65._24_4_ = -auVar119._24_4_ * 0.0;
          auVar65._28_4_ = auVar111._28_4_;
          auVar108 = vfmadd213ps_fma(auVar142,auVar142,ZEXT832(0) << 0x20);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar169,auVar169);
          auVar111 = vrsqrtps_avx(ZEXT1632(auVar108));
          auVar119 = ZEXT1632(CONCAT412(fVar171 * 0.0,
                                        CONCAT48(fVar170 * 0.0,CONCAT44(fVar132 * 0.0,fVar133 * 0.0)
                                                )));
          fVar133 = auVar111._0_4_;
          fVar132 = auVar111._4_4_;
          fVar170 = auVar111._8_4_;
          fVar171 = auVar111._12_4_;
          fVar172 = auVar111._16_4_;
          fVar173 = auVar111._20_4_;
          fVar174 = auVar111._24_4_;
          auVar66._4_4_ = fVar132 * fVar132 * fVar132 * auVar108._4_4_ * -0.5;
          auVar66._0_4_ = fVar133 * fVar133 * fVar133 * auVar108._0_4_ * -0.5;
          auVar66._8_4_ = fVar170 * fVar170 * fVar170 * auVar108._8_4_ * -0.5;
          auVar66._12_4_ = fVar171 * fVar171 * fVar171 * auVar108._12_4_ * -0.5;
          auVar66._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar66._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar66._24_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar66._28_4_ = 0;
          auVar108 = vfmadd231ps_fma(auVar66,auVar158,auVar111);
          fVar133 = auVar108._0_4_;
          fVar132 = auVar108._4_4_;
          auVar67._4_4_ = auVar169._4_4_ * fVar132;
          auVar67._0_4_ = auVar169._0_4_ * fVar133;
          fVar170 = auVar108._8_4_;
          auVar67._8_4_ = auVar169._8_4_ * fVar170;
          fVar171 = auVar108._12_4_;
          auVar67._12_4_ = auVar169._12_4_ * fVar171;
          auVar67._16_4_ = auVar169._16_4_ * 0.0;
          auVar67._20_4_ = auVar169._20_4_ * 0.0;
          auVar67._24_4_ = auVar169._24_4_ * 0.0;
          auVar67._28_4_ = 0;
          auVar68._4_4_ = fVar132 * -auVar142._4_4_;
          auVar68._0_4_ = fVar133 * -auVar142._0_4_;
          auVar68._8_4_ = fVar170 * -auVar142._8_4_;
          auVar68._12_4_ = fVar171 * -auVar142._12_4_;
          auVar68._16_4_ = -auVar142._16_4_ * 0.0;
          auVar68._20_4_ = -auVar142._20_4_ * 0.0;
          auVar68._24_4_ = -auVar142._24_4_ * 0.0;
          auVar68._28_4_ = auVar111._28_4_;
          auVar69._28_4_ = 0xbf000000;
          auVar69._0_28_ =
               ZEXT1628(CONCAT412(fVar171 * 0.0,
                                  CONCAT48(fVar170 * 0.0,CONCAT44(fVar132 * 0.0,fVar133 * 0.0))));
          auVar108 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar152),local_660);
          auVar111 = ZEXT1632(auVar152);
          auVar161 = vfmadd213ps_fma(auVar65,auVar111,local_640);
          auVar147 = vfmadd213ps_fma(auVar119,auVar111,ZEXT1632(auVar15));
          auVar187 = vfnmadd213ps_fma(auVar64,auVar111,local_660);
          auVar176 = vfmadd213ps_fma(auVar67,_local_5a0,ZEXT1632(auVar11));
          auVar25 = vfnmadd213ps_fma(auVar65,auVar111,local_640);
          auVar177 = vfmadd213ps_fma(auVar68,_local_5a0,auVar113);
          auVar183 = ZEXT1632(auVar152);
          auVar152 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar183,auVar119);
          auVar15 = vfmadd213ps_fma(auVar69,_local_5a0,ZEXT1632(auVar149));
          auVar26 = vfnmadd213ps_fma(auVar67,_local_5a0,ZEXT1632(auVar11));
          auVar123 = vfnmadd213ps_fma(auVar68,_local_5a0,auVar113);
          auVar188 = vfnmadd231ps_fma(ZEXT1632(auVar149),_local_5a0,auVar69);
          auVar111 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar25));
          auVar142 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar152));
          auVar184._0_4_ = auVar111._0_4_ * auVar152._0_4_;
          auVar184._4_4_ = auVar111._4_4_ * auVar152._4_4_;
          auVar184._8_4_ = auVar111._8_4_ * auVar152._8_4_;
          auVar184._12_4_ = auVar111._12_4_ * auVar152._12_4_;
          auVar184._16_4_ = auVar111._16_4_ * 0.0;
          auVar184._20_4_ = auVar111._20_4_ * 0.0;
          auVar184._24_4_ = auVar111._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar184,ZEXT1632(auVar25),auVar142);
          auVar70._4_4_ = auVar187._4_4_ * auVar142._4_4_;
          auVar70._0_4_ = auVar187._0_4_ * auVar142._0_4_;
          auVar70._8_4_ = auVar187._8_4_ * auVar142._8_4_;
          auVar70._12_4_ = auVar187._12_4_ * auVar142._12_4_;
          auVar70._16_4_ = auVar142._16_4_ * 0.0;
          auVar70._20_4_ = auVar142._20_4_ * 0.0;
          auVar70._24_4_ = auVar142._24_4_ * 0.0;
          auVar70._28_4_ = auVar142._28_4_;
          auVar165 = ZEXT1632(auVar187);
          auVar142 = vsubps_avx(ZEXT1632(auVar176),auVar165);
          auVar121 = ZEXT1632(auVar152);
          auVar152 = vfmsub231ps_fma(auVar70,auVar121,auVar142);
          auVar71._4_4_ = auVar25._4_4_ * auVar142._4_4_;
          auVar71._0_4_ = auVar25._0_4_ * auVar142._0_4_;
          auVar71._8_4_ = auVar25._8_4_ * auVar142._8_4_;
          auVar71._12_4_ = auVar25._12_4_ * auVar142._12_4_;
          auVar71._16_4_ = auVar142._16_4_ * 0.0;
          auVar71._20_4_ = auVar142._20_4_ * 0.0;
          auVar71._24_4_ = auVar142._24_4_ * 0.0;
          auVar71._28_4_ = auVar142._28_4_;
          auVar149 = vfmsub231ps_fma(auVar71,auVar165,auVar111);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar149),ZEXT832(0) << 0x20,ZEXT1632(auVar152));
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar21 = vcmpps_avx(ZEXT1632(auVar152),ZEXT832(0) << 0x20,2);
          auVar111 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar108),auVar21);
          auVar142 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar161),auVar21);
          auVar169 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar147),auVar21);
          auVar119 = vblendvps_avx(auVar165,ZEXT1632(auVar176),auVar21);
          auVar129 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar177),auVar21);
          auVar23 = vblendvps_avx(auVar121,ZEXT1632(auVar15),auVar21);
          auVar165 = vblendvps_avx(ZEXT1632(auVar176),auVar165,auVar21);
          auVar24 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar25),auVar21);
          auVar152 = vpackssdw_avx(local_560._0_16_,local_560._16_16_);
          auVar121 = vblendvps_avx(ZEXT1632(auVar15),auVar121,auVar21);
          auVar165 = vsubps_avx(auVar165,auVar111);
          auVar24 = vsubps_avx(auVar24,auVar142);
          auVar22 = vsubps_avx(auVar121,auVar169);
          auVar209 = ZEXT3264(auVar22);
          auVar113 = vsubps_avx(auVar111,auVar119);
          auVar162 = vsubps_avx(auVar142,auVar129);
          auVar189 = vsubps_avx(auVar169,auVar23);
          auVar166._0_4_ = auVar22._0_4_ * auVar111._0_4_;
          auVar166._4_4_ = auVar22._4_4_ * auVar111._4_4_;
          auVar166._8_4_ = auVar22._8_4_ * auVar111._8_4_;
          auVar166._12_4_ = auVar22._12_4_ * auVar111._12_4_;
          auVar166._16_4_ = auVar22._16_4_ * auVar111._16_4_;
          auVar166._20_4_ = auVar22._20_4_ * auVar111._20_4_;
          auVar166._24_4_ = auVar22._24_4_ * auVar111._24_4_;
          auVar166._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar166,auVar169,auVar165);
          auVar72._4_4_ = auVar165._4_4_ * auVar142._4_4_;
          auVar72._0_4_ = auVar165._0_4_ * auVar142._0_4_;
          auVar72._8_4_ = auVar165._8_4_ * auVar142._8_4_;
          auVar72._12_4_ = auVar165._12_4_ * auVar142._12_4_;
          auVar72._16_4_ = auVar165._16_4_ * auVar142._16_4_;
          auVar72._20_4_ = auVar165._20_4_ * auVar142._20_4_;
          auVar72._24_4_ = auVar165._24_4_ * auVar142._24_4_;
          auVar72._28_4_ = auVar121._28_4_;
          auVar149 = vfmsub231ps_fma(auVar72,auVar111,auVar24);
          auVar121 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar121,ZEXT1632(auVar11));
          auVar167._0_4_ = auVar24._0_4_ * auVar169._0_4_;
          auVar167._4_4_ = auVar24._4_4_ * auVar169._4_4_;
          auVar167._8_4_ = auVar24._8_4_ * auVar169._8_4_;
          auVar167._12_4_ = auVar24._12_4_ * auVar169._12_4_;
          auVar167._16_4_ = auVar24._16_4_ * auVar169._16_4_;
          auVar167._20_4_ = auVar24._20_4_ * auVar169._20_4_;
          auVar167._24_4_ = auVar24._24_4_ * auVar169._24_4_;
          auVar167._28_4_ = 0;
          auVar149 = vfmsub231ps_fma(auVar167,auVar142,auVar22);
          auVar149 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,ZEXT1632(auVar149));
          auVar146 = ZEXT1664(auVar149);
          auVar168._0_4_ = auVar119._0_4_ * auVar189._0_4_;
          auVar168._4_4_ = auVar119._4_4_ * auVar189._4_4_;
          auVar168._8_4_ = auVar119._8_4_ * auVar189._8_4_;
          auVar168._12_4_ = auVar119._12_4_ * auVar189._12_4_;
          auVar168._16_4_ = auVar119._16_4_ * auVar189._16_4_;
          auVar168._20_4_ = auVar119._20_4_ * auVar189._20_4_;
          auVar168._24_4_ = auVar119._24_4_ * auVar189._24_4_;
          auVar168._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar168,auVar113,auVar23);
          auVar73._4_4_ = auVar162._4_4_ * auVar23._4_4_;
          auVar73._0_4_ = auVar162._0_4_ * auVar23._0_4_;
          auVar73._8_4_ = auVar162._8_4_ * auVar23._8_4_;
          auVar73._12_4_ = auVar162._12_4_ * auVar23._12_4_;
          auVar73._16_4_ = auVar162._16_4_ * auVar23._16_4_;
          auVar73._20_4_ = auVar162._20_4_ * auVar23._20_4_;
          auVar73._24_4_ = auVar162._24_4_ * auVar23._24_4_;
          auVar73._28_4_ = auVar23._28_4_;
          auVar15 = vfmsub231ps_fma(auVar73,auVar129,auVar189);
          auVar74._4_4_ = auVar113._4_4_ * auVar129._4_4_;
          auVar74._0_4_ = auVar113._0_4_ * auVar129._0_4_;
          auVar74._8_4_ = auVar113._8_4_ * auVar129._8_4_;
          auVar74._12_4_ = auVar113._12_4_ * auVar129._12_4_;
          auVar74._16_4_ = auVar113._16_4_ * auVar129._16_4_;
          auVar74._20_4_ = auVar113._20_4_ * auVar129._20_4_;
          auVar74._24_4_ = auVar113._24_4_ * auVar129._24_4_;
          auVar74._28_4_ = auVar129._28_4_;
          auVar108 = vfmsub231ps_fma(auVar74,auVar162,auVar119);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar121,ZEXT1632(auVar11));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,ZEXT1632(auVar15));
          auVar119 = vmaxps_avx(ZEXT1632(auVar149),ZEXT1632(auVar15));
          auVar119 = vcmpps_avx(auVar119,auVar121,2);
          auVar11 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
          auVar152 = vpand_avx(auVar11,auVar152);
          auVar119 = vpmovsxwd_avx2(auVar152);
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar119 >> 0x7f,0) == '\0') &&
                (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0xbf,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar119[0x1f]) {
LAB_0139df51:
            auVar191 = ZEXT3264(CONCAT824(uStack_5a8,
                                          CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            auVar111 = vpcmpeqd_avx2(auVar165,auVar165);
            auVar197 = ZEXT3264(auVar111);
            auVar159 = ZEXT3264(auVar159._0_32_);
            auVar203 = ZEXT3264(auVar124);
          }
          else {
            auVar75._4_4_ = auVar24._4_4_ * auVar189._4_4_;
            auVar75._0_4_ = auVar24._0_4_ * auVar189._0_4_;
            auVar75._8_4_ = auVar24._8_4_ * auVar189._8_4_;
            auVar75._12_4_ = auVar24._12_4_ * auVar189._12_4_;
            auVar75._16_4_ = auVar24._16_4_ * auVar189._16_4_;
            auVar75._20_4_ = auVar24._20_4_ * auVar189._20_4_;
            auVar75._24_4_ = auVar24._24_4_ * auVar189._24_4_;
            auVar75._28_4_ = auVar119._28_4_;
            auVar147 = vfmsub231ps_fma(auVar75,auVar162,auVar22);
            auVar185._0_4_ = auVar22._0_4_ * auVar113._0_4_;
            auVar185._4_4_ = auVar22._4_4_ * auVar113._4_4_;
            auVar185._8_4_ = auVar22._8_4_ * auVar113._8_4_;
            auVar185._12_4_ = auVar22._12_4_ * auVar113._12_4_;
            auVar185._16_4_ = auVar22._16_4_ * auVar113._16_4_;
            auVar185._20_4_ = auVar22._20_4_ * auVar113._20_4_;
            auVar185._24_4_ = auVar22._24_4_ * auVar113._24_4_;
            auVar185._28_4_ = 0;
            auVar161 = vfmsub231ps_fma(auVar185,auVar165,auVar189);
            auVar76._4_4_ = auVar165._4_4_ * auVar162._4_4_;
            auVar76._0_4_ = auVar165._0_4_ * auVar162._0_4_;
            auVar76._8_4_ = auVar165._8_4_ * auVar162._8_4_;
            auVar76._12_4_ = auVar165._12_4_ * auVar162._12_4_;
            auVar76._16_4_ = auVar165._16_4_ * auVar162._16_4_;
            auVar76._20_4_ = auVar165._20_4_ * auVar162._20_4_;
            auVar76._24_4_ = auVar165._24_4_ * auVar162._24_4_;
            auVar76._28_4_ = auVar162._28_4_;
            auVar176 = vfmsub231ps_fma(auVar76,auVar113,auVar24);
            auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar161),ZEXT1632(auVar176));
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar147),auVar121);
            auVar165 = ZEXT1632(auVar108);
            auVar119 = vrcpps_avx(ZEXT1632(auVar108));
            auVar208._8_4_ = 0x3f800000;
            auVar208._0_8_ = 0x3f8000003f800000;
            auVar208._12_4_ = 0x3f800000;
            auVar208._16_4_ = 0x3f800000;
            auVar208._20_4_ = 0x3f800000;
            auVar208._24_4_ = 0x3f800000;
            auVar208._28_4_ = 0x3f800000;
            auVar209 = ZEXT3264(auVar208);
            auVar11 = vfnmadd213ps_fma(auVar119,ZEXT1632(auVar108),auVar208);
            auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar119,auVar119);
            auVar77._4_4_ = auVar176._4_4_ * auVar169._4_4_;
            auVar77._0_4_ = auVar176._0_4_ * auVar169._0_4_;
            auVar77._8_4_ = auVar176._8_4_ * auVar169._8_4_;
            auVar77._12_4_ = auVar176._12_4_ * auVar169._12_4_;
            auVar77._16_4_ = auVar169._16_4_ * 0.0;
            auVar77._20_4_ = auVar169._20_4_ * 0.0;
            auVar77._24_4_ = auVar169._24_4_ * 0.0;
            auVar77._28_4_ = auVar169._28_4_;
            auVar161 = vfmadd231ps_fma(auVar77,auVar142,ZEXT1632(auVar161));
            auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT1632(auVar147),auVar111);
            fVar133 = auVar11._0_4_;
            fVar132 = auVar11._4_4_;
            fVar170 = auVar11._8_4_;
            fVar171 = auVar11._12_4_;
            auVar169 = ZEXT1632(CONCAT412(fVar171 * auVar161._12_4_,
                                          CONCAT48(fVar170 * auVar161._8_4_,
                                                   CONCAT44(fVar132 * auVar161._4_4_,
                                                            fVar133 * auVar161._0_4_))));
            uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar148._4_4_ = uVar104;
            auVar148._0_4_ = uVar104;
            auVar148._8_4_ = uVar104;
            auVar148._12_4_ = uVar104;
            auVar148._16_4_ = uVar104;
            auVar148._20_4_ = uVar104;
            auVar148._24_4_ = uVar104;
            auVar148._28_4_ = uVar104;
            auVar91._4_4_ = uStack_11c;
            auVar91._0_4_ = local_120;
            auVar91._8_4_ = uStack_118;
            auVar91._12_4_ = uStack_114;
            auVar91._16_4_ = uStack_110;
            auVar91._20_4_ = uStack_10c;
            auVar91._24_4_ = uStack_108;
            auVar91._28_4_ = uStack_104;
            auVar111 = vcmpps_avx(auVar91,auVar169,2);
            auVar142 = vcmpps_avx(auVar169,auVar148,2);
            auVar111 = vandps_avx(auVar142,auVar111);
            auVar11 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
            auVar152 = vpand_avx(auVar152,auVar11);
            auVar111 = vpmovsxwd_avx2(auVar152);
            if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar111 >> 0x7f,0) == '\0') &&
                  (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0xbf,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar111[0x1f]) goto LAB_0139df51;
            auVar111 = vcmpps_avx(ZEXT1632(auVar108),ZEXT832(0) << 0x20,4);
            auVar108 = auVar111._16_16_;
            auVar11 = vpackssdw_avx(auVar111._0_16_,auVar108);
            auVar152 = vpand_avx(auVar152,auVar11);
            auVar142 = vpmovsxwd_avx2(auVar152);
            auVar191 = ZEXT3264(CONCAT824(uStack_5a8,
                                          CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            auVar111 = vpcmpeqd_avx2(ZEXT1632(auVar108),ZEXT1632(auVar108));
            auVar197 = ZEXT3264(auVar111);
            auVar159 = ZEXT3264(auVar159._0_32_);
            auVar203 = ZEXT3264(auVar124);
            if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0x7f,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0xbf,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar142[0x1f] < '\0') {
              auVar119 = ZEXT1632(CONCAT412(fVar171 * auVar149._12_4_,
                                            CONCAT48(fVar170 * auVar149._8_4_,
                                                     CONCAT44(fVar132 * auVar149._4_4_,
                                                              fVar133 * auVar149._0_4_))));
              auVar78._28_4_ = SUB84(uStack_5a8,4);
              auVar78._0_28_ =
                   ZEXT1628(CONCAT412(fVar171 * auVar15._12_4_,
                                      CONCAT48(fVar170 * auVar15._8_4_,
                                               CONCAT44(fVar132 * auVar15._4_4_,
                                                        fVar133 * auVar15._0_4_))));
              auVar194._8_4_ = 0x3f800000;
              auVar194._0_8_ = 0x3f8000003f800000;
              auVar194._12_4_ = 0x3f800000;
              auVar194._16_4_ = 0x3f800000;
              auVar194._20_4_ = 0x3f800000;
              auVar194._24_4_ = 0x3f800000;
              auVar194._28_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar194,auVar119);
              auVar111 = vblendvps_avx(auVar111,auVar119,auVar21);
              auVar159 = ZEXT3264(auVar111);
              auVar111 = vsubps_avx(auVar194,auVar78);
              local_4e0 = vblendvps_avx(auVar111,auVar78,auVar21);
              auVar146 = ZEXT3264(local_4e0);
              auVar191 = ZEXT3264(auVar142);
              auVar203 = ZEXT3264(auVar169);
            }
          }
          auVar111 = auVar191._0_32_;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar191[0x1f]) {
            auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,CONCAT416(
                                                  fVar204,CONCAT412(fVar204,CONCAT48(fVar204,
                                                  CONCAT44(fVar204,fVar204))))))));
            auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar107
                                                                                    )))))));
          }
          else {
            auVar142 = vsubps_avx(_local_5a0,auVar183);
            local_680 = auVar159._0_32_;
            auVar152 = vfmadd213ps_fma(auVar142,local_680,auVar183);
            fVar133 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar79._4_4_ = (auVar152._4_4_ + auVar152._4_4_) * fVar133;
            auVar79._0_4_ = (auVar152._0_4_ + auVar152._0_4_) * fVar133;
            auVar79._8_4_ = (auVar152._8_4_ + auVar152._8_4_) * fVar133;
            auVar79._12_4_ = (auVar152._12_4_ + auVar152._12_4_) * fVar133;
            auVar79._16_4_ = fVar133 * 0.0;
            auVar79._20_4_ = fVar133 * 0.0;
            auVar79._24_4_ = fVar133 * 0.0;
            auVar79._28_4_ = fVar133;
            auVar119 = auVar203._0_32_;
            auVar142 = vcmpps_avx(auVar119,auVar79,6);
            auVar169 = auVar111 & auVar142;
            auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,CONCAT416(
                                                  fVar204,CONCAT412(fVar204,CONCAT48(fVar204,
                                                  CONCAT44(fVar204,fVar204))))))));
            auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,CONCAT416(
                                                  fVar222,CONCAT412(fVar225,CONCAT48(fVar222,uVar107
                                                                                    )))))));
            if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0x7f,0) != '\0') ||
                  (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0xbf,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar169[0x1f] < '\0') {
              auVar131._8_4_ = 0xbf800000;
              auVar131._0_8_ = 0xbf800000bf800000;
              auVar131._12_4_ = 0xbf800000;
              auVar131._16_4_ = 0xbf800000;
              auVar131._20_4_ = 0xbf800000;
              auVar131._24_4_ = 0xbf800000;
              auVar131._28_4_ = 0xbf800000;
              auVar144._8_4_ = 0x40000000;
              auVar144._0_8_ = 0x4000000040000000;
              auVar144._12_4_ = 0x40000000;
              auVar144._16_4_ = 0x40000000;
              auVar144._20_4_ = 0x40000000;
              auVar144._24_4_ = 0x40000000;
              auVar144._28_4_ = 0x40000000;
              auVar146 = ZEXT3264(auVar144);
              auVar152 = vfmadd213ps_fma(local_4e0,auVar144,auVar131);
              local_380 = ZEXT1632(auVar152);
              pGVar18 = (context->scene->geometries).items[uVar97].ptr;
              local_4e0 = local_380;
              if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar99 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar99 = context->args;
                if ((pRVar99->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar99 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar99 >> 8),1),
                   pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_640 = ZEXT1632(CONCAT88(auVar20._8_8_,pGVar18));
                  auVar111 = vandps_avx(auVar142,auVar111);
                  fVar133 = (float)local_340;
                  auVar146 = ZEXT3264(CONCAT428(fVar133,CONCAT424(fVar133,CONCAT420(fVar133,
                                                  CONCAT416(fVar133,CONCAT412(fVar133,CONCAT48(
                                                  fVar133,CONCAT44(fVar133,fVar133))))))));
                  local_2c0[0] = (fVar133 + auVar159._0_4_ + 0.0) * local_140;
                  local_2c0[1] = (fVar133 + auVar159._4_4_ + 1.0) * fStack_13c;
                  local_2c0[2] = (fVar133 + auVar159._8_4_ + 2.0) * fStack_138;
                  local_2c0[3] = (fVar133 + auVar159._12_4_ + 3.0) * fStack_134;
                  fStack_2b0 = (fVar133 + auVar159._16_4_ + 4.0) * fStack_130;
                  fStack_2ac = (fVar133 + auVar159._20_4_ + 5.0) * fStack_12c;
                  fStack_2a8 = (fVar133 + auVar159._24_4_ + 6.0) * fStack_128;
                  fStack_2a4 = fVar133 + auVar159._28_4_ + 7.0;
                  local_4e0._0_8_ = auVar152._0_8_;
                  local_4e0._8_8_ = auVar152._8_8_;
                  local_2a0 = local_4e0._0_8_;
                  uStack_298 = local_4e0._8_8_;
                  uStack_290 = 0;
                  uStack_288 = 0;
                  local_280 = auVar119;
                  uVar104 = vmovmskps_avx(auVar111);
                  uVar98 = 0;
                  uVar100 = CONCAT44((int)((ulong)pRVar99 >> 0x20),uVar104);
                  for (uVar103 = uVar100; _local_460 = *pauVar5, local_3a0 = local_680,
                      local_360 = auVar119, local_33c = iVar96, local_330 = uVar160,
                      uStack_328 = uVar86, local_320 = uVar87, uStack_318 = uVar88,
                      local_310 = uVar89, uStack_308 = uVar90, (uVar103 & 1) == 0;
                      uVar103 = uVar103 >> 1 | 0x8000000000000000) {
                    uVar98 = uVar98 + 1;
                  }
                  while (auVar111 = auVar197._0_32_, uVar100 != 0) {
                    uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar133 = local_2c0[uVar98];
                    auVar110._4_4_ = fVar133;
                    auVar110._0_4_ = fVar133;
                    auVar110._8_4_ = fVar133;
                    auVar110._12_4_ = fVar133;
                    local_200._16_4_ = fVar133;
                    local_200._0_16_ = auVar110;
                    local_200._20_4_ = fVar133;
                    local_200._24_4_ = fVar133;
                    local_200._28_4_ = fVar133;
                    local_1e0 = *(undefined4 *)((long)&local_2a0 + uVar98 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_280 + uVar98 * 4);
                    fVar170 = 1.0 - fVar133;
                    auVar152 = ZEXT416((uint)(fVar133 * fVar170 * 4.0));
                    auVar20 = vfnmsub213ss_fma(auVar110,auVar110,auVar152);
                    auVar152 = vfmadd213ss_fma(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),
                                               auVar152);
                    fVar132 = auVar152._0_4_ * 0.5;
                    fVar133 = fVar133 * fVar133 * 0.5;
                    auVar153._0_4_ = fVar133 * local_6b0;
                    auVar153._4_4_ = fVar133 * fStack_6ac;
                    auVar153._8_4_ = fVar133 * fStack_6a8;
                    auVar153._12_4_ = fVar133 * fStack_6a4;
                    auVar136._4_4_ = fVar132;
                    auVar136._0_4_ = fVar132;
                    auVar136._8_4_ = fVar132;
                    auVar136._12_4_ = fVar132;
                    auVar152 = vfmadd132ps_fma(auVar136,auVar153,auVar12);
                    fVar133 = auVar20._0_4_ * 0.5;
                    auVar154._4_4_ = fVar133;
                    auVar154._0_4_ = fVar133;
                    auVar154._8_4_ = fVar133;
                    auVar154._12_4_ = fVar133;
                    auVar152 = vfmadd132ps_fma(auVar154,auVar152,auVar13);
                    local_6e0.context = context->user;
                    fVar133 = fVar170 * -fVar170 * 0.5;
                    auVar137._4_4_ = fVar133;
                    auVar137._0_4_ = fVar133;
                    auVar137._8_4_ = fVar133;
                    auVar137._12_4_ = fVar133;
                    auVar20 = vfmadd132ps_fma(auVar137,auVar152,auVar14);
                    local_260 = auVar20._0_4_;
                    uStack_25c = local_260;
                    uStack_258 = local_260;
                    uStack_254 = local_260;
                    uStack_250 = local_260;
                    uStack_24c = local_260;
                    uStack_248 = local_260;
                    uStack_244 = local_260;
                    auVar152 = vmovshdup_avx(auVar20);
                    local_240 = auVar152._0_8_;
                    uStack_238 = local_240;
                    uStack_230 = local_240;
                    uStack_228 = local_240;
                    auVar152 = vshufps_avx(auVar20,auVar20,0xaa);
                    auVar138._0_8_ = auVar152._0_8_;
                    auVar138._8_8_ = auVar138._0_8_;
                    local_220._16_8_ = auVar138._0_8_;
                    local_220._0_16_ = auVar138;
                    local_220._24_8_ = auVar138._0_8_;
                    auVar146 = ZEXT3264(local_220);
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_520._0_8_;
                    uStack_1b8 = local_520._8_8_;
                    uStack_1b0 = CONCAT44(uStack_50c,uStack_510);
                    uStack_1a8 = CONCAT44(uStack_504,uStack_508);
                    local_1a0 = local_500;
                    uStack_198 = uStack_4f8;
                    uStack_190 = CONCAT44(uStack_4ec,uStack_4f0);
                    uStack_188 = CONCAT44(uStack_4e4,uStack_4e8);
                    local_180 = (local_6e0.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_6e0.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_600 = local_440;
                    local_6e0.valid = (int *)local_600;
                    local_6e0.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                    local_6e0.hit = (RTCHitN *)&local_260;
                    local_6e0.N = 8;
                    local_6e0.ray = (RTCRayN *)ray;
                    if (*(code **)(local_640._0_8_ + 0x48) != (code *)0x0) {
                      auVar146 = ZEXT1664(auVar138);
                      auVar111 = ZEXT1632(auVar197._0_16_);
                      auVar209 = ZEXT1664(auVar209._0_16_);
                      (**(code **)(local_640._0_8_ + 0x48))(&local_6e0);
                    }
                    auVar142 = vpcmpeqd_avx2(local_600,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar169 = vpcmpeqd_avx2(auVar111,auVar111);
                    auVar111 = auVar169 & ~auVar142;
                    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar111 >> 0x7f,0) == '\0') &&
                          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar111 >> 0xbf,0) == '\0') &&
                        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar111[0x1f]) {
                      auVar142 = auVar169 ^ auVar142;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar169 = ZEXT1632(auVar169._0_16_);
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (*p_Var19)(&local_6e0);
                      }
                      auVar111 = vpcmpeqd_avx2(local_600,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
                      ;
                      auVar169 = vpcmpeqd_avx2(auVar169,auVar169);
                      auVar142 = auVar169 ^ auVar111;
                      auVar145._8_4_ = 0xff800000;
                      auVar145._0_8_ = 0xff800000ff800000;
                      auVar145._12_4_ = 0xff800000;
                      auVar145._16_4_ = 0xff800000;
                      auVar145._20_4_ = 0xff800000;
                      auVar145._24_4_ = 0xff800000;
                      auVar145._28_4_ = 0xff800000;
                      auVar146 = ZEXT3264(auVar145);
                      auVar111 = vblendvps_avx(auVar145,*(undefined1 (*) [32])
                                                         (local_6e0.ray + 0x100),auVar111);
                      *(undefined1 (*) [32])(local_6e0.ray + 0x100) = auVar111;
                    }
                    auVar197 = ZEXT3264(auVar169);
                    if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar142 >> 0x7f,0) != '\0') ||
                          (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar142 >> 0xbf,0) != '\0') ||
                        (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar142[0x1f] < '\0') {
                      pRVar99 = (RTCIntersectArguments *)0x1;
                      goto LAB_0139df94;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar104;
                    uVar103 = uVar98 & 0x3f;
                    uVar98 = 0;
                    uVar100 = uVar100 ^ 1L << uVar103;
                    for (uVar103 = uVar100; (uVar103 & 1) == 0;
                        uVar103 = uVar103 >> 1 | 0x8000000000000000) {
                      uVar98 = uVar98 + 1;
                    }
                  }
                  pRVar99 = (RTCIntersectArguments *)0x0;
LAB_0139df94:
                  auVar159 = ZEXT3264(local_680);
                  auVar203 = ZEXT3264(auVar119);
                  auVar191 = ZEXT3264(CONCAT428(fVar204,CONCAT424(fVar204,CONCAT420(fVar204,
                                                  CONCAT416(fVar204,CONCAT412(fVar204,CONCAT48(
                                                  fVar204,CONCAT44(fVar204,fVar204))))))));
                  auVar186 = ZEXT3264(CONCAT428(fVar225,CONCAT424(fVar222,CONCAT420(fVar225,
                                                  CONCAT416(fVar222,CONCAT412(fVar225,CONCAT48(
                                                  fVar222,uVar107)))))));
                }
              }
              uVar102 = (ulong)(byte)((byte)uVar102 | (byte)pRVar99);
            }
          }
        }
      }
    }
    if ((uVar102 & 1) != 0) break;
    uVar104 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar120._4_4_ = uVar104;
    auVar120._0_4_ = uVar104;
    auVar120._8_4_ = uVar104;
    auVar120._12_4_ = uVar104;
    auVar120._16_4_ = uVar104;
    auVar120._20_4_ = uVar104;
    auVar120._24_4_ = uVar104;
    auVar120._28_4_ = uVar104;
    auVar111 = vcmpps_avx(local_80,auVar120,2);
    uVar97 = vmovmskps_avx(auVar111);
    local_5c8 = (ulong)((uint)uVar106 & uVar97);
  }
  return local_5c8 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }